

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution1D_x86_fma::forward
          (Convolution1D_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  _func_int *p_Var7;
  long lVar8;
  size_t sVar9;
  size_t sVar10;
  void *pvVar11;
  size_t sVar12;
  void *pvVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  int *piVar21;
  undefined1 auVar22 [16];
  void *pvVar23;
  char cVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  undefined1 (*pauVar36) [32];
  uint uVar37;
  long lVar38;
  long lVar39;
  _func_int ***ppp_Var40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  void *pvVar45;
  _func_int ***ppp_Var46;
  int iVar47;
  uint uVar48;
  long lVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  int iVar53;
  undefined4 *puVar54;
  undefined1 (*pauVar55) [32];
  float *pfVar56;
  int iVar57;
  long lVar58;
  undefined4 *puVar59;
  long lVar60;
  undefined1 (*pauVar61) [32];
  undefined1 (*pauVar62) [16];
  bool bVar63;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar65;
  float fVar66;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar88 [64];
  undefined4 extraout_XMM0_Dd;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 extraout_var_00 [60];
  float sum [4];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [28];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar115 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [64];
  undefined1 auVar126 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar125;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar127 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [16];
  undefined1 auVar204 [64];
  __m128 one;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [64];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [64];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [16];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [16];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [16];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [64];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [32];
  int elempack;
  Allocator *local_200;
  ulong local_1f8;
  void *local_1e0;
  undefined1 (*local_1d0) [32];
  ulong local_1c8;
  undefined1 local_1a8 [16];
  uint local_198;
  undefined1 (*local_188) [16];
  ulong local_180;
  ulong local_170;
  long local_158;
  long local_150;
  undefined1 local_118 [16];
  uint local_f8;
  Mat local_c8;
  ulong local_80;
  ulong local_78;
  long local_70;
  ulong local_68;
  ulong local_60;
  long local_58;
  long local_50;
  long local_48;
  void *local_40;
  void *local_38;
  float fVar64;
  undefined1 auVar85 [32];
  float fVar89;
  undefined1 auVar114 [32];
  undefined1 auVar116 [32];
  
  uVar34 = bottom_blob->elemsize;
  iVar4 = bottom_blob->elempack;
  p_Var7 = this->_vptr_Convolution1D_x86_fma[-3];
  iVar5 = *(int *)(&this->field_0xd4 + (long)p_Var7);
  iVar6 = *(int *)(&this->field_0xd8 + (long)p_Var7);
  local_c8.cstep = 0;
  local_c8.data = (Allocator *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_c8.elempack = 0;
  local_c8.h = 0;
  local_c8.allocator = (Allocator *)local_c8.data;
  local_c8.dims = (int)local_c8.refcount;
  local_c8.w = local_c8.refcount._4_4_;
  local_c8.d = (int)local_c8.refcount;
  local_c8.c = local_c8.elempack;
  Convolution1D::make_padding
            ((Convolution1D *)((long)&this->_vptr_Convolution1D_x86_fma + (long)p_Var7),bottom_blob,
             &local_c8,opt);
  iVar47 = -100;
  if (((Allocator *)local_c8.data != (Allocator *)0x0) && ((long)local_c8.c * local_c8.cstep != 0))
  {
    uVar37 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_fma[-3]);
    lVar30 = 1;
    if (opt->use_packing_layout == true) {
      lVar30 = 8;
      if ((uVar37 & 7) != 0) {
        lVar30 = (ulong)((uVar37 & 3) == 0) * 3 + 1;
      }
    }
    Mat::create(top_blob,(local_c8.w + ~((iVar5 + -1) * iVar6)) /
                         *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86_fma[-3]) +
                         1,(int)uVar37 / (int)lVar30,lVar30 * (uVar34 / (ulong)(long)iVar4),
                (int)lVar30,opt->blob_allocator);
    iVar4 = local_c8.elempack;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      p_Var7 = this->_vptr_Convolution1D_x86_fma[-3];
      iVar5 = *(int *)(&this->field_0xd4 + (long)p_Var7);
      uVar37 = *(uint *)(&this->field_0xf4 + (long)p_Var7);
      local_78 = (ulong)uVar37;
      iVar6 = *(int *)(&this->field_0xd8 + (long)p_Var7);
      lVar30 = (long)iVar6;
      iVar47 = *(int *)(&this->field_0xdc + (long)p_Var7);
      lVar31 = (long)iVar47;
      uVar25 = local_c8.h * local_c8.elempack;
      iVar26 = local_c8.w * local_c8.elempack;
      local_58 = (long)top_blob->w;
      local_80 = (long)top_blob->h * (long)top_blob->elempack;
      lVar58 = top_blob->elempack * local_58;
      iVar29 = (int)local_80;
      iVar57 = iVar29 + 7;
      if (-1 < iVar29) {
        iVar57 = iVar29;
      }
      lVar8 = *(long *)(&this->field_0x190 + (long)p_Var7);
      uVar50 = iVar57 >> 3;
      lVar60 = (long)iVar26;
      iVar57 = (int)lVar58;
      if (7 < iVar29) {
        auVar210 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar204 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar213 = ZEXT1664(ZEXT816(0) << 0x40);
        local_70 = lVar60 * 4;
        local_1f8 = 0;
        auVar310._8_4_ = 0x3f318000;
        auVar310._0_8_ = 0x3f3180003f318000;
        auVar310._12_4_ = 0x3f318000;
        auVar310._16_4_ = 0x3f318000;
        auVar310._20_4_ = 0x3f318000;
        auVar310._24_4_ = 0x3f318000;
        auVar310._28_4_ = 0x3f318000;
        do {
          lVar32 = (long)top_blob->w;
          if (0 < lVar32) {
            uVar48 = local_c8.h * local_c8.elempack;
            iVar53 = top_blob->elempack;
            local_1d0 = (undefined1 (*) [32])
                        ((int)((long)((ulong)(uint)((int)(local_1f8 * 8) >> 0x1f) << 0x20 |
                                     local_1f8 * 8 & 0xffffffff) / (long)iVar53) * lVar32 *
                         top_blob->elemsize + (long)top_blob->data);
            auVar91._8_8_ = 0;
            auVar91._0_8_ = local_118._8_8_;
            local_118 = auVar91 << 0x40;
            iVar43 = 0;
            auVar126._8_8_ = 0;
            auVar126._0_8_ = local_1a8._8_8_;
            local_1a8 = auVar126 << 0x40;
            local_150 = local_70;
            do {
              auVar305 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar88 = ZEXT1664(ZEXT816(0) << 0x40);
              if (lVar8 != 0) {
                auVar88 = ZEXT3264(*(undefined1 (*) [32])(lVar8 + local_1f8 * 0x20));
              }
              pauVar61 = (undefined1 (*) [32])
                         ((this->weight_data_tm).cstep * local_1f8 * (this->weight_data_tm).elemsize
                         + (long)(this->weight_data_tm).data);
              if ((int)uVar48 < 8) {
                auVar161 = ZEXT864(0);
                auVar124 = ZEXT864(0);
                uVar27 = 0;
              }
              else {
                auVar124 = ZEXT864(0);
                auVar161 = ZEXT864(0);
                iVar42 = 0;
                do {
                  lVar33 = (long)(iVar42 / local_c8.elempack) * (long)local_c8.w * local_c8.elemsize
                  ;
                  if (local_c8.elempack == 8) {
                    if (0 < iVar5) {
                      puVar54 = (undefined4 *)
                                ((long)(_func_int ***)local_c8.data + lVar33 + (long)iVar43 * 4);
                      iVar41 = iVar5;
                      do {
                        uVar2 = *puVar54;
                        auVar84._4_4_ = uVar2;
                        auVar84._0_4_ = uVar2;
                        auVar84._8_4_ = uVar2;
                        auVar84._12_4_ = uVar2;
                        auVar84._16_4_ = uVar2;
                        auVar84._20_4_ = uVar2;
                        auVar84._24_4_ = uVar2;
                        auVar84._28_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar84,auVar88._0_32_,*pauVar61);
                        uVar2 = puVar54[1];
                        auVar255._4_4_ = uVar2;
                        auVar255._0_4_ = uVar2;
                        auVar255._8_4_ = uVar2;
                        auVar255._12_4_ = uVar2;
                        auVar255._16_4_ = uVar2;
                        auVar255._20_4_ = uVar2;
                        auVar255._24_4_ = uVar2;
                        auVar255._28_4_ = uVar2;
                        auVar126 = vfmadd132ps_fma(auVar255,auVar124._0_32_,pauVar61[1]);
                        uVar2 = puVar54[2];
                        auVar266._4_4_ = uVar2;
                        auVar266._0_4_ = uVar2;
                        auVar266._8_4_ = uVar2;
                        auVar266._12_4_ = uVar2;
                        auVar266._16_4_ = uVar2;
                        auVar266._20_4_ = uVar2;
                        auVar266._24_4_ = uVar2;
                        auVar266._28_4_ = uVar2;
                        auVar90 = vfmadd132ps_fma(auVar266,auVar161._0_32_,pauVar61[2]);
                        uVar2 = puVar54[3];
                        auVar285._4_4_ = uVar2;
                        auVar285._0_4_ = uVar2;
                        auVar285._8_4_ = uVar2;
                        auVar285._12_4_ = uVar2;
                        auVar285._16_4_ = uVar2;
                        auVar285._20_4_ = uVar2;
                        auVar285._24_4_ = uVar2;
                        auVar285._28_4_ = uVar2;
                        auVar92 = vfmadd132ps_fma(auVar285,auVar305._0_32_,pauVar61[3]);
                        uVar2 = puVar54[4];
                        auVar79._4_4_ = uVar2;
                        auVar79._0_4_ = uVar2;
                        auVar79._8_4_ = uVar2;
                        auVar79._12_4_ = uVar2;
                        auVar79._16_4_ = uVar2;
                        auVar79._20_4_ = uVar2;
                        auVar79._24_4_ = uVar2;
                        auVar79._28_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar79,ZEXT1632(auVar91),pauVar61[4]);
                        auVar88 = ZEXT1664(auVar91);
                        uVar2 = puVar54[5];
                        auVar111._4_4_ = uVar2;
                        auVar111._0_4_ = uVar2;
                        auVar111._8_4_ = uVar2;
                        auVar111._12_4_ = uVar2;
                        auVar111._16_4_ = uVar2;
                        auVar111._20_4_ = uVar2;
                        auVar111._24_4_ = uVar2;
                        auVar111._28_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar111,ZEXT1632(auVar126),pauVar61[5]);
                        auVar124 = ZEXT1664(auVar91);
                        uVar2 = puVar54[6];
                        auVar145._4_4_ = uVar2;
                        auVar145._0_4_ = uVar2;
                        auVar145._8_4_ = uVar2;
                        auVar145._12_4_ = uVar2;
                        auVar145._16_4_ = uVar2;
                        auVar145._20_4_ = uVar2;
                        auVar145._24_4_ = uVar2;
                        auVar145._28_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar145,ZEXT1632(auVar90),pauVar61[6]);
                        auVar161 = ZEXT1664(auVar91);
                        uVar2 = puVar54[7];
                        auVar301._4_4_ = uVar2;
                        auVar301._0_4_ = uVar2;
                        auVar301._8_4_ = uVar2;
                        auVar301._12_4_ = uVar2;
                        auVar301._16_4_ = uVar2;
                        auVar301._20_4_ = uVar2;
                        auVar301._24_4_ = uVar2;
                        auVar301._28_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar301,ZEXT1632(auVar92),pauVar61[7]);
                        auVar305 = ZEXT1664(auVar91);
                        pauVar61 = pauVar61 + 8;
                        puVar54 = puVar54 + iVar6 * 8;
                        iVar41 = iVar41 + -1;
                      } while (iVar41 != 0);
                      goto LAB_004fd060;
                    }
                  }
                  else {
                    puVar54 = (undefined4 *)
                              ((long)(_func_int ***)local_c8.data +
                              lVar33 + (long)(iVar47 * local_c8.elempack * local_1a8._0_4_) * 4);
LAB_004fd060:
                    if (local_c8.elempack == 4) {
                      iVar41 = iVar5;
                      if (iVar5 < 1) goto LAB_004fd189;
                      do {
                        uVar2 = *puVar54;
                        auVar225._4_4_ = uVar2;
                        auVar225._0_4_ = uVar2;
                        auVar225._8_4_ = uVar2;
                        auVar225._12_4_ = uVar2;
                        auVar225._16_4_ = uVar2;
                        auVar225._20_4_ = uVar2;
                        auVar225._24_4_ = uVar2;
                        auVar225._28_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar225,auVar88._0_32_,*pauVar61);
                        uVar2 = puVar54[1];
                        auVar256._4_4_ = uVar2;
                        auVar256._0_4_ = uVar2;
                        auVar256._8_4_ = uVar2;
                        auVar256._12_4_ = uVar2;
                        auVar256._16_4_ = uVar2;
                        auVar256._20_4_ = uVar2;
                        auVar256._24_4_ = uVar2;
                        auVar256._28_4_ = uVar2;
                        auVar126 = vfmadd132ps_fma(auVar256,auVar124._0_32_,pauVar61[1]);
                        uVar2 = puVar54[2];
                        auVar267._4_4_ = uVar2;
                        auVar267._0_4_ = uVar2;
                        auVar267._8_4_ = uVar2;
                        auVar267._12_4_ = uVar2;
                        auVar267._16_4_ = uVar2;
                        auVar267._20_4_ = uVar2;
                        auVar267._24_4_ = uVar2;
                        auVar267._28_4_ = uVar2;
                        auVar90 = vfmadd132ps_fma(auVar267,auVar161._0_32_,pauVar61[2]);
                        uVar2 = puVar54[3];
                        auVar286._4_4_ = uVar2;
                        auVar286._0_4_ = uVar2;
                        auVar286._8_4_ = uVar2;
                        auVar286._12_4_ = uVar2;
                        auVar286._16_4_ = uVar2;
                        auVar286._20_4_ = uVar2;
                        auVar286._24_4_ = uVar2;
                        auVar286._28_4_ = uVar2;
                        auVar92 = vfmadd132ps_fma(auVar286,auVar305._0_32_,pauVar61[3]);
                        uVar2 = puVar54[lVar60];
                        auVar80._4_4_ = uVar2;
                        auVar80._0_4_ = uVar2;
                        auVar80._8_4_ = uVar2;
                        auVar80._12_4_ = uVar2;
                        auVar80._16_4_ = uVar2;
                        auVar80._20_4_ = uVar2;
                        auVar80._24_4_ = uVar2;
                        auVar80._28_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar80,ZEXT1632(auVar91),pauVar61[4]);
                        auVar88 = ZEXT1664(auVar91);
                        uVar2 = puVar54[lVar60 + 1];
                        auVar112._4_4_ = uVar2;
                        auVar112._0_4_ = uVar2;
                        auVar112._8_4_ = uVar2;
                        auVar112._12_4_ = uVar2;
                        auVar112._16_4_ = uVar2;
                        auVar112._20_4_ = uVar2;
                        auVar112._24_4_ = uVar2;
                        auVar112._28_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar112,ZEXT1632(auVar126),pauVar61[5]);
                        auVar124 = ZEXT1664(auVar91);
                        uVar2 = puVar54[lVar60 + 2];
                        auVar146._4_4_ = uVar2;
                        auVar146._0_4_ = uVar2;
                        auVar146._8_4_ = uVar2;
                        auVar146._12_4_ = uVar2;
                        auVar146._16_4_ = uVar2;
                        auVar146._20_4_ = uVar2;
                        auVar146._24_4_ = uVar2;
                        auVar146._28_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar146,ZEXT1632(auVar90),pauVar61[6]);
                        auVar161 = ZEXT1664(auVar91);
                        uVar2 = puVar54[lVar60 + 3];
                        auVar302._4_4_ = uVar2;
                        auVar302._0_4_ = uVar2;
                        auVar302._8_4_ = uVar2;
                        auVar302._12_4_ = uVar2;
                        auVar302._16_4_ = uVar2;
                        auVar302._20_4_ = uVar2;
                        auVar302._24_4_ = uVar2;
                        auVar302._28_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar302,ZEXT1632(auVar92),pauVar61[7]);
                        auVar305 = ZEXT1664(auVar91);
                        pauVar61 = pauVar61 + 8;
                        puVar54 = puVar54 + iVar6 * 4;
                        iVar41 = iVar41 + -1;
                      } while (iVar41 != 0);
                    }
                    if ((local_c8.elempack == 1) && (iVar41 = iVar5, 0 < iVar5)) {
                      do {
                        uVar2 = *puVar54;
                        auVar226._4_4_ = uVar2;
                        auVar226._0_4_ = uVar2;
                        auVar226._8_4_ = uVar2;
                        auVar226._12_4_ = uVar2;
                        auVar226._16_4_ = uVar2;
                        auVar226._20_4_ = uVar2;
                        auVar226._24_4_ = uVar2;
                        auVar226._28_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar226,auVar88._0_32_,*pauVar61);
                        uVar2 = puVar54[lVar60];
                        auVar257._4_4_ = uVar2;
                        auVar257._0_4_ = uVar2;
                        auVar257._8_4_ = uVar2;
                        auVar257._12_4_ = uVar2;
                        auVar257._16_4_ = uVar2;
                        auVar257._20_4_ = uVar2;
                        auVar257._24_4_ = uVar2;
                        auVar257._28_4_ = uVar2;
                        auVar126 = vfmadd132ps_fma(auVar257,auVar124._0_32_,pauVar61[1]);
                        uVar2 = puVar54[iVar26 * 2];
                        auVar268._4_4_ = uVar2;
                        auVar268._0_4_ = uVar2;
                        auVar268._8_4_ = uVar2;
                        auVar268._12_4_ = uVar2;
                        auVar268._16_4_ = uVar2;
                        auVar268._20_4_ = uVar2;
                        auVar268._24_4_ = uVar2;
                        auVar268._28_4_ = uVar2;
                        auVar90 = vfmadd132ps_fma(auVar268,auVar161._0_32_,pauVar61[2]);
                        uVar2 = puVar54[iVar26 * 3];
                        auVar287._4_4_ = uVar2;
                        auVar287._0_4_ = uVar2;
                        auVar287._8_4_ = uVar2;
                        auVar287._12_4_ = uVar2;
                        auVar287._16_4_ = uVar2;
                        auVar287._20_4_ = uVar2;
                        auVar287._24_4_ = uVar2;
                        auVar287._28_4_ = uVar2;
                        auVar92 = vfmadd132ps_fma(auVar287,auVar305._0_32_,pauVar61[3]);
                        uVar2 = puVar54[iVar26 * 4];
                        auVar81._4_4_ = uVar2;
                        auVar81._0_4_ = uVar2;
                        auVar81._8_4_ = uVar2;
                        auVar81._12_4_ = uVar2;
                        auVar81._16_4_ = uVar2;
                        auVar81._20_4_ = uVar2;
                        auVar81._24_4_ = uVar2;
                        auVar81._28_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar81,ZEXT1632(auVar91),pauVar61[4]);
                        auVar88 = ZEXT1664(auVar91);
                        uVar2 = puVar54[iVar26 * 5];
                        auVar113._4_4_ = uVar2;
                        auVar113._0_4_ = uVar2;
                        auVar113._8_4_ = uVar2;
                        auVar113._12_4_ = uVar2;
                        auVar113._16_4_ = uVar2;
                        auVar113._20_4_ = uVar2;
                        auVar113._24_4_ = uVar2;
                        auVar113._28_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar113,ZEXT1632(auVar126),pauVar61[5]);
                        auVar124 = ZEXT1664(auVar91);
                        uVar2 = puVar54[iVar26 * 6];
                        auVar147._4_4_ = uVar2;
                        auVar147._0_4_ = uVar2;
                        auVar147._8_4_ = uVar2;
                        auVar147._12_4_ = uVar2;
                        auVar147._16_4_ = uVar2;
                        auVar147._20_4_ = uVar2;
                        auVar147._24_4_ = uVar2;
                        auVar147._28_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar147,ZEXT1632(auVar90),pauVar61[6]);
                        auVar161 = ZEXT1664(auVar91);
                        uVar2 = puVar54[iVar26 * 7];
                        auVar303._4_4_ = uVar2;
                        auVar303._0_4_ = uVar2;
                        auVar303._8_4_ = uVar2;
                        auVar303._12_4_ = uVar2;
                        auVar303._16_4_ = uVar2;
                        auVar303._20_4_ = uVar2;
                        auVar303._24_4_ = uVar2;
                        auVar303._28_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar303,ZEXT1632(auVar92),pauVar61[7]);
                        auVar305 = ZEXT1664(auVar91);
                        pauVar61 = pauVar61 + 8;
                        puVar54 = puVar54 + lVar30;
                        iVar41 = iVar41 + -1;
                      } while (iVar41 != 0);
                    }
                  }
LAB_004fd189:
                  iVar41 = iVar42 + 0xf;
                  iVar42 = iVar42 + 8;
                  uVar27 = uVar48 & 0xfffffff8;
                } while (iVar41 < (int)uVar48);
              }
              auVar111 = auVar305._0_32_;
              auVar79 = auVar161._0_32_;
              if ((int)(uVar27 | 3) < (int)uVar48) {
                uVar51 = uVar27;
                do {
                  lVar33 = (long)((int)uVar51 / local_c8.elempack) *
                           (long)local_c8.w * local_c8.elemsize;
                  if (local_c8.elempack == 4) {
                    if (0 < iVar5) {
                      puVar54 = (undefined4 *)
                                ((long)(_func_int ***)local_c8.data + lVar33 + (long)iVar43 * 4);
                      iVar42 = iVar5;
                      do {
                        uVar2 = *puVar54;
                        auVar227._4_4_ = uVar2;
                        auVar227._0_4_ = uVar2;
                        auVar227._8_4_ = uVar2;
                        auVar227._12_4_ = uVar2;
                        auVar227._16_4_ = uVar2;
                        auVar227._20_4_ = uVar2;
                        auVar227._24_4_ = uVar2;
                        auVar227._28_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar88._0_32_,auVar227,*pauVar61);
                        auVar88 = ZEXT1664(auVar91);
                        uVar2 = puVar54[1];
                        auVar228._4_4_ = uVar2;
                        auVar228._0_4_ = uVar2;
                        auVar228._8_4_ = uVar2;
                        auVar228._12_4_ = uVar2;
                        auVar228._16_4_ = uVar2;
                        auVar228._20_4_ = uVar2;
                        auVar228._24_4_ = uVar2;
                        auVar228._28_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar124._0_32_,auVar228,pauVar61[1]);
                        auVar124 = ZEXT1664(auVar91);
                        uVar2 = puVar54[2];
                        auVar229._4_4_ = uVar2;
                        auVar229._0_4_ = uVar2;
                        auVar229._8_4_ = uVar2;
                        auVar229._12_4_ = uVar2;
                        auVar229._16_4_ = uVar2;
                        auVar229._20_4_ = uVar2;
                        auVar229._24_4_ = uVar2;
                        auVar229._28_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar161._0_32_,auVar229,pauVar61[2]);
                        auVar161 = ZEXT1664(auVar91);
                        uVar2 = puVar54[3];
                        auVar230._4_4_ = uVar2;
                        auVar230._0_4_ = uVar2;
                        auVar230._8_4_ = uVar2;
                        auVar230._12_4_ = uVar2;
                        auVar230._16_4_ = uVar2;
                        auVar230._20_4_ = uVar2;
                        auVar230._24_4_ = uVar2;
                        auVar230._28_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar305._0_32_,auVar230,pauVar61[3]);
                        auVar305 = ZEXT1664(auVar91);
                        pauVar61 = pauVar61 + 4;
                        puVar54 = puVar54 + iVar6 * 4;
                        iVar42 = iVar42 + -1;
                      } while (iVar42 != 0);
                      goto LAB_004fd257;
                    }
                  }
                  else {
                    puVar54 = (undefined4 *)
                              ((long)(_func_int ***)local_c8.data +
                              lVar33 + (long)(iVar47 * local_c8.elempack * local_1a8._0_4_) * 4);
LAB_004fd257:
                    if ((local_c8.elempack == 1) && (iVar42 = iVar5, 0 < iVar5)) {
                      do {
                        uVar2 = *puVar54;
                        auVar231._4_4_ = uVar2;
                        auVar231._0_4_ = uVar2;
                        auVar231._8_4_ = uVar2;
                        auVar231._12_4_ = uVar2;
                        auVar231._16_4_ = uVar2;
                        auVar231._20_4_ = uVar2;
                        auVar231._24_4_ = uVar2;
                        auVar231._28_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar88._0_32_,auVar231,*pauVar61);
                        auVar88 = ZEXT1664(auVar91);
                        uVar2 = puVar54[lVar60];
                        auVar232._4_4_ = uVar2;
                        auVar232._0_4_ = uVar2;
                        auVar232._8_4_ = uVar2;
                        auVar232._12_4_ = uVar2;
                        auVar232._16_4_ = uVar2;
                        auVar232._20_4_ = uVar2;
                        auVar232._24_4_ = uVar2;
                        auVar232._28_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar124._0_32_,auVar232,pauVar61[1]);
                        auVar124 = ZEXT1664(auVar91);
                        uVar2 = puVar54[iVar26 * 2];
                        auVar233._4_4_ = uVar2;
                        auVar233._0_4_ = uVar2;
                        auVar233._8_4_ = uVar2;
                        auVar233._12_4_ = uVar2;
                        auVar233._16_4_ = uVar2;
                        auVar233._20_4_ = uVar2;
                        auVar233._24_4_ = uVar2;
                        auVar233._28_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar161._0_32_,auVar233,pauVar61[2]);
                        auVar161 = ZEXT1664(auVar91);
                        uVar2 = puVar54[iVar26 * 3];
                        auVar234._4_4_ = uVar2;
                        auVar234._0_4_ = uVar2;
                        auVar234._8_4_ = uVar2;
                        auVar234._12_4_ = uVar2;
                        auVar234._16_4_ = uVar2;
                        auVar234._20_4_ = uVar2;
                        auVar234._24_4_ = uVar2;
                        auVar234._28_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar305._0_32_,auVar234,pauVar61[3]);
                        auVar305 = ZEXT1664(auVar91);
                        pauVar61 = pauVar61 + 4;
                        puVar54 = puVar54 + lVar30;
                        iVar42 = iVar42 + -1;
                      } while (iVar42 != 0);
                    }
                  }
                  auVar111 = auVar305._0_32_;
                  auVar79 = auVar161._0_32_;
                  uVar27 = uVar51 + 4;
                  iVar42 = uVar51 + 7;
                  uVar51 = uVar27;
                } while (iVar42 < (int)uVar48);
              }
              auVar145 = auVar124._0_32_;
              uVar34 = (ulong)uVar27;
              if ((int)(uVar27 | 1) < (int)uVar48) {
                lVar38 = (long)local_c8.w * local_c8.elemsize * uVar34;
                lVar49 = (long)(_func_int ***)local_c8.data + lVar38 + local_150;
                lVar33 = (long)local_c8.w * local_c8.elemsize * 2;
                lVar38 = (long)(_func_int ***)local_c8.data + lVar38 + local_118._0_8_;
                do {
                  if (0 < iVar5) {
                    lVar39 = 0;
                    iVar42 = iVar5;
                    do {
                      uVar2 = *(undefined4 *)(lVar38 + lVar39);
                      auVar235._4_4_ = uVar2;
                      auVar235._0_4_ = uVar2;
                      auVar235._8_4_ = uVar2;
                      auVar235._12_4_ = uVar2;
                      auVar235._16_4_ = uVar2;
                      auVar235._20_4_ = uVar2;
                      auVar235._24_4_ = uVar2;
                      auVar235._28_4_ = uVar2;
                      auVar91 = vfmadd231ps_fma(auVar88._0_32_,auVar235,*pauVar61);
                      auVar88 = ZEXT1664(auVar91);
                      uVar2 = *(undefined4 *)(lVar49 + lVar39);
                      auVar236._4_4_ = uVar2;
                      auVar236._0_4_ = uVar2;
                      auVar236._8_4_ = uVar2;
                      auVar236._12_4_ = uVar2;
                      auVar236._16_4_ = uVar2;
                      auVar236._20_4_ = uVar2;
                      auVar236._24_4_ = uVar2;
                      auVar236._28_4_ = uVar2;
                      auVar91 = vfmadd231ps_fma(auVar124._0_32_,auVar236,pauVar61[1]);
                      auVar124 = ZEXT1664(auVar91);
                      pauVar61 = pauVar61 + 2;
                      lVar39 = lVar39 + lVar30 * 4;
                      iVar42 = iVar42 + -1;
                    } while (iVar42 != 0);
                  }
                  auVar145 = auVar124._0_32_;
                  uVar34 = uVar34 + 2;
                  uVar27 = (uint)uVar34;
                  lVar49 = lVar49 + lVar33;
                  lVar38 = lVar38 + lVar33;
                } while ((int)(uVar27 | 1) < (int)uVar48);
              }
              auVar84 = auVar88._0_32_;
              if ((int)uVar27 < (int)uVar48) {
                uVar34 = (ulong)uVar27;
                puVar54 = (undefined4 *)
                          ((long)(_func_int ***)local_c8.data +
                          (long)local_c8.w * local_c8.elemsize * uVar34 + local_118._0_8_);
                do {
                  puVar59 = puVar54;
                  iVar42 = iVar5;
                  if (0 < iVar5) {
                    do {
                      uVar2 = *puVar59;
                      auVar237._4_4_ = uVar2;
                      auVar237._0_4_ = uVar2;
                      auVar237._8_4_ = uVar2;
                      auVar237._12_4_ = uVar2;
                      auVar237._16_4_ = uVar2;
                      auVar237._20_4_ = uVar2;
                      auVar237._24_4_ = uVar2;
                      auVar237._28_4_ = uVar2;
                      auVar91 = vfmadd231ps_fma(auVar88._0_32_,auVar237,*pauVar61);
                      auVar88 = ZEXT1664(auVar91);
                      pauVar61 = pauVar61 + 1;
                      puVar59 = puVar59 + lVar30;
                      iVar42 = iVar42 + -1;
                    } while (iVar42 != 0);
                  }
                  auVar84 = auVar88._0_32_;
                  uVar34 = uVar34 + 1;
                  puVar54 = (undefined4 *)((long)puVar54 + (long)local_c8.w * local_c8.elemsize);
                } while ((int)uVar34 < (int)uVar48);
              }
              fVar64 = auVar111._0_4_ + auVar79._0_4_ + auVar145._0_4_ + auVar84._0_4_;
              fVar89 = auVar111._4_4_ + auVar79._4_4_ + auVar145._4_4_ + auVar84._4_4_;
              auVar82._0_8_ = CONCAT44(fVar89,fVar64);
              auVar82._8_4_ = auVar111._8_4_ + auVar79._8_4_ + auVar145._8_4_ + auVar84._8_4_;
              auVar82._12_4_ = auVar111._12_4_ + auVar79._12_4_ + auVar145._12_4_ + auVar84._12_4_;
              auVar82._16_4_ = auVar111._16_4_ + auVar79._16_4_ + auVar145._16_4_ + auVar84._16_4_;
              auVar82._20_4_ = auVar111._20_4_ + auVar79._20_4_ + auVar145._20_4_ + auVar84._20_4_;
              auVar82._24_4_ = auVar111._24_4_ + auVar79._24_4_ + auVar145._24_4_ + auVar84._24_4_;
              auVar82._28_4_ = auVar111._28_4_ + auVar79._28_4_ + auVar145._28_4_ + auVar84._28_4_;
              auVar145 = auVar213._0_32_;
              auVar79 = auVar204._0_32_;
              auVar111 = auVar210._0_32_;
              fVar66 = auVar204._0_4_;
              fVar65 = auVar204._4_4_;
              fVar3 = auVar204._8_4_;
              fVar125 = auVar204._12_4_;
              fVar14 = auVar204._16_4_;
              fVar15 = auVar204._20_4_;
              fVar16 = auVar204._24_4_;
              fVar17 = auVar204._28_4_;
              switch(uVar37) {
              case 1:
                auVar82 = vmaxps_avx(auVar82,auVar145);
                break;
              case 2:
                auVar79 = vmaxps_avx(auVar82,auVar145);
                auVar111 = vminps_avx(auVar82,auVar145);
                uVar2 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var7);
                auVar87._4_4_ = uVar2;
                auVar87._0_4_ = uVar2;
                auVar87._8_4_ = uVar2;
                auVar87._12_4_ = uVar2;
                auVar87._16_4_ = uVar2;
                auVar87._20_4_ = uVar2;
                auVar87._24_4_ = uVar2;
                auVar87._28_4_ = uVar2;
                auVar91 = vfmadd213ps_fma(auVar87,auVar111,auVar79);
                auVar82 = ZEXT1632(auVar91);
                break;
              case 3:
                uVar2 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var7);
                auVar118._4_4_ = uVar2;
                auVar118._0_4_ = uVar2;
                auVar118._8_4_ = uVar2;
                auVar118._12_4_ = uVar2;
                auVar118._16_4_ = uVar2;
                auVar118._20_4_ = uVar2;
                auVar118._24_4_ = uVar2;
                auVar118._28_4_ = uVar2;
                uVar2 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var7))[1];
                auVar155._4_4_ = uVar2;
                auVar155._0_4_ = uVar2;
                auVar155._8_4_ = uVar2;
                auVar155._12_4_ = uVar2;
                auVar155._16_4_ = uVar2;
                auVar155._20_4_ = uVar2;
                auVar155._24_4_ = uVar2;
                auVar155._28_4_ = uVar2;
                auVar79 = vmaxps_avx(auVar82,auVar118);
                auVar82 = vminps_avx(auVar79,auVar155);
                break;
              case 4:
                auVar83._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
                auVar83._8_4_ = -auVar82._8_4_;
                auVar83._12_4_ = -auVar82._12_4_;
                auVar83._16_4_ = -auVar82._16_4_;
                auVar83._20_4_ = -auVar82._20_4_;
                auVar83._24_4_ = -auVar82._24_4_;
                auVar83._28_4_ = -auVar82._28_4_;
                auVar119._8_4_ = 0x42b0c0a5;
                auVar119._0_8_ = 0x42b0c0a542b0c0a5;
                auVar119._12_4_ = 0x42b0c0a5;
                auVar119._16_4_ = 0x42b0c0a5;
                auVar119._20_4_ = 0x42b0c0a5;
                auVar119._24_4_ = 0x42b0c0a5;
                auVar119._28_4_ = 0x42b0c0a5;
                auVar145 = vminps_avx(auVar83,auVar119);
                auVar120._8_4_ = 0xc2b0c0a5;
                auVar120._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar120._12_4_ = 0xc2b0c0a5;
                auVar120._16_4_ = 0xc2b0c0a5;
                auVar120._20_4_ = 0xc2b0c0a5;
                auVar120._24_4_ = 0xc2b0c0a5;
                auVar120._28_4_ = 0xc2b0c0a5;
                auVar84 = vmaxps_avx(auVar145,auVar120);
                auVar121._8_4_ = 0x3fb8aa3b;
                auVar121._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar121._12_4_ = 0x3fb8aa3b;
                auVar121._16_4_ = 0x3fb8aa3b;
                auVar121._20_4_ = 0x3fb8aa3b;
                auVar121._24_4_ = 0x3fb8aa3b;
                auVar121._28_4_ = 0x3fb8aa3b;
                auVar91 = vfmadd213ps_fma(auVar121,auVar84,auVar111);
                auVar255 = vroundps_avx(ZEXT1632(auVar91),1);
                auVar145 = vcmpps_avx(ZEXT1632(auVar91),auVar255,1);
                auVar145 = vandps_avx(auVar145,auVar79);
                auVar145 = vsubps_avx(auVar255,auVar145);
                auVar156._8_4_ = 0x3f318000;
                auVar156._0_8_ = 0x3f3180003f318000;
                auVar156._12_4_ = 0x3f318000;
                auVar156._16_4_ = 0x3f318000;
                auVar156._20_4_ = 0x3f318000;
                auVar156._24_4_ = 0x3f318000;
                auVar156._28_4_ = 0x3f318000;
                auVar91 = vfmsub231ps_fma(auVar84,auVar145,auVar156);
                auVar157._8_4_ = 0x395e8083;
                auVar157._0_8_ = 0x395e8083395e8083;
                auVar157._12_4_ = 0x395e8083;
                auVar157._16_4_ = 0x395e8083;
                auVar157._20_4_ = 0x395e8083;
                auVar157._24_4_ = 0x395e8083;
                auVar157._28_4_ = 0x395e8083;
                auVar126 = vfmsub231ps_fma(ZEXT1632(auVar91),auVar145,auVar157);
                auVar84 = ZEXT1632(auVar126);
                auVar20._28_4_ = 0x395e8083;
                auVar20._0_28_ =
                     ZEXT1628(CONCAT412(auVar126._12_4_ * auVar126._12_4_,
                                        CONCAT48(auVar126._8_4_ * auVar126._8_4_,
                                                 CONCAT44(auVar126._4_4_ * auVar126._4_4_,
                                                          auVar126._0_4_ * auVar126._0_4_))));
                auVar241._8_4_ = 0x39506967;
                auVar241._0_8_ = 0x3950696739506967;
                auVar241._12_4_ = 0x39506967;
                auVar241._16_4_ = 0x39506967;
                auVar241._20_4_ = 0x39506967;
                auVar241._24_4_ = 0x39506967;
                auVar241._28_4_ = 0x39506967;
                auVar201._8_4_ = 0x3ab743ce;
                auVar201._0_8_ = 0x3ab743ce3ab743ce;
                auVar201._12_4_ = 0x3ab743ce;
                auVar201._16_4_ = 0x3ab743ce;
                auVar201._20_4_ = 0x3ab743ce;
                auVar201._24_4_ = 0x3ab743ce;
                auVar201._28_4_ = 0x3ab743ce;
                auVar91 = vfmadd213ps_fma(auVar241,auVar84,auVar201);
                auVar202._8_4_ = 0x3c088908;
                auVar202._0_8_ = 0x3c0889083c088908;
                auVar202._12_4_ = 0x3c088908;
                auVar202._16_4_ = 0x3c088908;
                auVar202._20_4_ = 0x3c088908;
                auVar202._24_4_ = 0x3c088908;
                auVar202._28_4_ = 0x3c088908;
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar84,auVar202);
                auVar191._8_4_ = 0x3d2aa9c1;
                auVar191._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar191._12_4_ = 0x3d2aa9c1;
                auVar191._16_4_ = 0x3d2aa9c1;
                auVar191._20_4_ = 0x3d2aa9c1;
                auVar191._24_4_ = 0x3d2aa9c1;
                auVar191._28_4_ = 0x3d2aa9c1;
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar84,auVar191);
                auVar192._8_4_ = 0x3e2aaaaa;
                auVar192._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar192._12_4_ = 0x3e2aaaaa;
                auVar192._16_4_ = 0x3e2aaaaa;
                auVar192._20_4_ = 0x3e2aaaaa;
                auVar192._24_4_ = 0x3e2aaaaa;
                auVar192._28_4_ = 0x3e2aaaaa;
                auVar84 = ZEXT1632(auVar126);
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar84,auVar192);
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar84,auVar111);
                auVar90 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar20,auVar84);
                auVar67._0_4_ = (int)auVar145._0_4_;
                auVar67._4_4_ = (int)auVar145._4_4_;
                auVar67._8_4_ = (int)auVar145._8_4_;
                auVar67._12_4_ = (int)auVar145._12_4_;
                auVar85._16_4_ = (int)auVar145._16_4_;
                auVar85._0_16_ = auVar67;
                auVar85._20_4_ = (int)auVar145._20_4_;
                auVar85._24_4_ = (int)auVar145._24_4_;
                auVar85._28_4_ = (int)auVar145._28_4_;
                auVar126 = vpslld_avx(auVar67,0x17);
                auVar91 = vpslld_avx(auVar85._16_16_,0x17);
                auVar127._8_4_ = 0x3f800000;
                auVar127._0_8_ = 0x3f8000003f800000;
                auVar127._12_4_ = 0x3f800000;
                auVar91 = vpaddd_avx(auVar91,auVar127);
                auVar126 = vpaddd_avx(auVar126,auVar127);
                auVar86._16_16_ = auVar91;
                auVar86._0_16_ = auVar126;
                auVar122._0_4_ = auVar90._0_4_ + fVar66;
                auVar122._4_4_ = auVar90._4_4_ + fVar65;
                auVar122._8_4_ = auVar90._8_4_ + fVar3;
                auVar122._12_4_ = auVar90._12_4_ + fVar125;
                auVar122._16_4_ = fVar14 + 0.0;
                auVar122._20_4_ = fVar15 + 0.0;
                auVar122._24_4_ = fVar16 + 0.0;
                auVar122._28_4_ = fVar17 + 0.0;
                auVar91 = vfmadd213ps_fma(auVar86,auVar122,auVar79);
                auVar111 = vrcpps_avx(ZEXT1632(auVar91));
                auVar91 = vfmsub213ps_fma(ZEXT1632(auVar91),auVar111,auVar79);
                auVar91 = vfnmadd132ps_fma(ZEXT1632(auVar91),auVar111,auVar111);
                auVar82 = ZEXT1632(auVar91);
                break;
              case 5:
                auVar304._8_4_ = 0x42b0c0a5;
                auVar304._0_8_ = 0x42b0c0a542b0c0a5;
                auVar304._12_4_ = 0x42b0c0a5;
                auVar304._16_4_ = 0x42b0c0a5;
                auVar304._20_4_ = 0x42b0c0a5;
                auVar304._24_4_ = 0x42b0c0a5;
                auVar304._28_4_ = 0x42b0c0a5;
                auVar145 = vminps_avx(auVar304,auVar82);
                auVar298._8_4_ = 0xc2b0c0a5;
                auVar298._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar298._12_4_ = 0xc2b0c0a5;
                auVar298._16_4_ = 0xc2b0c0a5;
                auVar298._20_4_ = 0xc2b0c0a5;
                auVar298._24_4_ = 0xc2b0c0a5;
                auVar298._28_4_ = 0xc2b0c0a5;
                auVar84 = vmaxps_avx(auVar298,auVar145);
                auVar148._8_4_ = 0x3fb8aa3b;
                auVar148._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar148._12_4_ = 0x3fb8aa3b;
                auVar148._16_4_ = 0x3fb8aa3b;
                auVar148._20_4_ = 0x3fb8aa3b;
                auVar148._24_4_ = 0x3fb8aa3b;
                auVar148._28_4_ = 0x3fb8aa3b;
                auVar91 = vfmadd213ps_fma(auVar148,auVar84,auVar111);
                auVar255 = vroundps_avx(ZEXT1632(auVar91),1);
                auVar145 = vcmpps_avx(ZEXT1632(auVar91),auVar255,1);
                auVar145 = vandps_avx(auVar145,auVar79);
                auVar145 = vsubps_avx(auVar255,auVar145);
                auVar91 = vfmsub231ps_fma(auVar84,auVar145,auVar310);
                auVar299._8_4_ = 0xb95e8083;
                auVar299._0_8_ = 0xb95e8083b95e8083;
                auVar299._12_4_ = 0xb95e8083;
                auVar299._16_4_ = 0xb95e8083;
                auVar299._20_4_ = 0xb95e8083;
                auVar299._24_4_ = 0xb95e8083;
                auVar299._28_4_ = 0xb95e8083;
                auVar126 = vfnmsub231ps_fma(ZEXT1632(auVar91),auVar145,auVar299);
                auVar84 = ZEXT1632(auVar126);
                auVar18._28_4_ = auVar255._28_4_;
                auVar18._0_28_ =
                     ZEXT1628(CONCAT412(auVar126._12_4_ * auVar126._12_4_,
                                        CONCAT48(auVar126._8_4_ * auVar126._8_4_,
                                                 CONCAT44(auVar126._4_4_ * auVar126._4_4_,
                                                          auVar126._0_4_ * auVar126._0_4_))));
                auVar258._8_4_ = 0x39506967;
                auVar258._0_8_ = 0x3950696739506967;
                auVar258._12_4_ = 0x39506967;
                auVar258._16_4_ = 0x39506967;
                auVar258._20_4_ = 0x39506967;
                auVar258._24_4_ = 0x39506967;
                auVar258._28_4_ = 0x39506967;
                auVar199._8_4_ = 0x3ab743ce;
                auVar199._0_8_ = 0x3ab743ce3ab743ce;
                auVar199._12_4_ = 0x3ab743ce;
                auVar199._16_4_ = 0x3ab743ce;
                auVar199._20_4_ = 0x3ab743ce;
                auVar199._24_4_ = 0x3ab743ce;
                auVar199._28_4_ = 0x3ab743ce;
                auVar91 = vfmadd213ps_fma(auVar258,auVar84,auVar199);
                auVar212._8_4_ = 0x3c088908;
                auVar212._0_8_ = 0x3c0889083c088908;
                auVar212._12_4_ = 0x3c088908;
                auVar212._16_4_ = 0x3c088908;
                auVar212._20_4_ = 0x3c088908;
                auVar212._24_4_ = 0x3c088908;
                auVar212._28_4_ = 0x3c088908;
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar84,auVar212);
                auVar190._8_4_ = 0x3d2aa9c1;
                auVar190._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar190._12_4_ = 0x3d2aa9c1;
                auVar190._16_4_ = 0x3d2aa9c1;
                auVar190._20_4_ = 0x3d2aa9c1;
                auVar190._24_4_ = 0x3d2aa9c1;
                auVar190._28_4_ = 0x3d2aa9c1;
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar84,auVar190);
                auVar209._8_4_ = 0x3e2aaaaa;
                auVar209._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar209._12_4_ = 0x3e2aaaaa;
                auVar209._16_4_ = 0x3e2aaaaa;
                auVar209._20_4_ = 0x3e2aaaaa;
                auVar209._24_4_ = 0x3e2aaaaa;
                auVar209._28_4_ = 0x3e2aaaaa;
                auVar84 = ZEXT1632(auVar126);
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar84,auVar209);
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar84,auVar111);
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar18,auVar84);
                auVar238._0_4_ = auVar91._0_4_ + fVar66;
                auVar238._4_4_ = auVar91._4_4_ + fVar65;
                auVar238._8_4_ = auVar91._8_4_ + fVar3;
                auVar238._12_4_ = auVar91._12_4_ + fVar125;
                auVar238._16_4_ = fVar14 + 0.0;
                auVar238._20_4_ = fVar15 + 0.0;
                auVar238._24_4_ = fVar16 + 0.0;
                auVar238._28_4_ = fVar17 + 0.0;
                auVar90._0_4_ = (int)auVar145._0_4_;
                auVar90._4_4_ = (int)auVar145._4_4_;
                auVar90._8_4_ = (int)auVar145._8_4_;
                auVar90._12_4_ = (int)auVar145._12_4_;
                auVar114._16_4_ = (int)auVar145._16_4_;
                auVar114._0_16_ = auVar90;
                auVar114._20_4_ = (int)auVar145._20_4_;
                auVar114._24_4_ = (int)auVar145._24_4_;
                auVar114._28_4_ = (int)auVar145._28_4_;
                auVar126 = vpslld_avx(auVar90,0x17);
                auVar91 = vpslld_avx(auVar114._16_16_,0x17);
                auVar162._8_4_ = 0x3f800000;
                auVar162._0_8_ = 0x3f8000003f800000;
                auVar162._12_4_ = 0x3f800000;
                auVar91 = vpaddd_avx(auVar91,auVar162);
                auVar126 = vpaddd_avx(auVar126,auVar162);
                auVar115._16_16_ = auVar91;
                auVar115._0_16_ = auVar126;
                auVar90 = vfmadd213ps_fma(auVar115,auVar238,auVar79);
                auVar149._8_4_ = 0x800000;
                auVar149._0_8_ = 0x80000000800000;
                auVar149._12_4_ = 0x800000;
                auVar149._16_4_ = 0x800000;
                auVar149._20_4_ = 0x800000;
                auVar149._24_4_ = 0x800000;
                auVar149._28_4_ = 0x800000;
                auVar145 = vmaxps_avx(ZEXT1632(auVar90),auVar149);
                auVar126 = vpsrld_avx(auVar145._0_16_,0x17);
                auVar91 = vpsrld_avx(auVar145._16_16_,0x17);
                auVar269._8_4_ = 0x807fffff;
                auVar269._0_8_ = 0x807fffff807fffff;
                auVar269._12_4_ = 0x807fffff;
                auVar269._16_4_ = 0x807fffff;
                auVar269._20_4_ = 0x807fffff;
                auVar269._24_4_ = 0x807fffff;
                auVar269._28_4_ = 0x807fffff;
                auVar145 = vandps_avx(auVar269,auVar145);
                auVar255 = vorps_avx(auVar145,auVar111);
                auVar270._8_4_ = 0x3f3504f3;
                auVar270._0_8_ = 0x3f3504f33f3504f3;
                auVar270._12_4_ = 0x3f3504f3;
                auVar270._16_4_ = 0x3f3504f3;
                auVar270._20_4_ = 0x3f3504f3;
                auVar270._24_4_ = 0x3f3504f3;
                auVar270._28_4_ = 0x3f3504f3;
                auVar84 = vcmpps_avx(auVar270,auVar255,2);
                auVar145 = vandnps_avx(auVar84,auVar255);
                auVar200._8_4_ = 0xbf800000;
                auVar200._0_8_ = 0xbf800000bf800000;
                auVar200._12_4_ = 0xbf800000;
                auVar200._16_4_ = 0xbf800000;
                auVar200._20_4_ = 0xbf800000;
                auVar200._24_4_ = 0xbf800000;
                auVar200._28_4_ = 0xbf800000;
                auVar150._0_4_ = auVar145._0_4_ + auVar255._0_4_ + -1.0;
                auVar150._4_4_ = auVar145._4_4_ + auVar255._4_4_ + -1.0;
                auVar150._8_4_ = auVar145._8_4_ + auVar255._8_4_ + -1.0;
                auVar150._12_4_ = auVar145._12_4_ + auVar255._12_4_ + -1.0;
                auVar150._16_4_ = auVar145._16_4_ + auVar255._16_4_ + -1.0;
                auVar150._20_4_ = auVar145._20_4_ + auVar255._20_4_ + -1.0;
                auVar150._24_4_ = auVar145._24_4_ + auVar255._24_4_ + -1.0;
                auVar150._28_4_ = auVar145._28_4_ + auVar255._28_4_ + -1.0;
                auVar91 = vpsubd_avx(auVar91,auVar84._16_16_);
                auVar273._8_4_ = 0xffffff81;
                auVar273._0_8_ = 0xffffff81ffffff81;
                auVar273._12_4_ = 0xffffff81;
                auVar91 = vpaddd_avx(auVar91,auVar273);
                auVar126 = vpsubd_avx(auVar126,auVar84._0_16_);
                auVar126 = vpaddd_avx(auVar126,auVar273);
                auVar239._16_16_ = auVar91;
                auVar239._0_16_ = auVar126;
                auVar259._0_4_ = auVar150._0_4_ * auVar150._0_4_;
                auVar259._4_4_ = auVar150._4_4_ * auVar150._4_4_;
                auVar259._8_4_ = auVar150._8_4_ * auVar150._8_4_;
                auVar259._12_4_ = auVar150._12_4_ * auVar150._12_4_;
                auVar259._16_4_ = auVar150._16_4_ * auVar150._16_4_;
                auVar259._20_4_ = auVar150._20_4_ * auVar150._20_4_;
                auVar259._24_4_ = auVar150._24_4_ * auVar150._24_4_;
                auVar259._28_4_ = 0;
                auVar271._8_4_ = 0x3d9021bb;
                auVar271._0_8_ = 0x3d9021bb3d9021bb;
                auVar271._12_4_ = 0x3d9021bb;
                auVar271._16_4_ = 0x3d9021bb;
                auVar271._20_4_ = 0x3d9021bb;
                auVar271._24_4_ = 0x3d9021bb;
                auVar271._28_4_ = 0x3d9021bb;
                auVar288._8_4_ = 0xbdebd1b8;
                auVar288._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar288._12_4_ = 0xbdebd1b8;
                auVar288._16_4_ = 0xbdebd1b8;
                auVar288._20_4_ = 0xbdebd1b8;
                auVar288._24_4_ = 0xbdebd1b8;
                auVar288._28_4_ = 0xbdebd1b8;
                auVar91 = vfmadd213ps_fma(auVar271,auVar150,auVar288);
                auVar289._8_4_ = 0x3def251a;
                auVar289._0_8_ = 0x3def251a3def251a;
                auVar289._12_4_ = 0x3def251a;
                auVar289._16_4_ = 0x3def251a;
                auVar289._20_4_ = 0x3def251a;
                auVar289._24_4_ = 0x3def251a;
                auVar289._28_4_ = 0x3def251a;
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar150,auVar289);
                auVar290._8_4_ = 0xbdfe5d4f;
                auVar290._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar290._12_4_ = 0xbdfe5d4f;
                auVar290._16_4_ = 0xbdfe5d4f;
                auVar290._20_4_ = 0xbdfe5d4f;
                auVar290._24_4_ = 0xbdfe5d4f;
                auVar290._28_4_ = 0xbdfe5d4f;
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar150,auVar290);
                auVar291._8_4_ = 0x3e11e9bf;
                auVar291._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar291._12_4_ = 0x3e11e9bf;
                auVar291._16_4_ = 0x3e11e9bf;
                auVar291._20_4_ = 0x3e11e9bf;
                auVar291._24_4_ = 0x3e11e9bf;
                auVar291._28_4_ = 0x3e11e9bf;
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar150,auVar291);
                auVar292._8_4_ = 0xbe2aae50;
                auVar292._0_8_ = 0xbe2aae50be2aae50;
                auVar292._12_4_ = 0xbe2aae50;
                auVar292._16_4_ = 0xbe2aae50;
                auVar292._20_4_ = 0xbe2aae50;
                auVar292._24_4_ = 0xbe2aae50;
                auVar292._28_4_ = 0xbe2aae50;
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar150,auVar292);
                auVar293._8_4_ = 0x3e4cceac;
                auVar293._0_8_ = 0x3e4cceac3e4cceac;
                auVar293._12_4_ = 0x3e4cceac;
                auVar293._16_4_ = 0x3e4cceac;
                auVar293._20_4_ = 0x3e4cceac;
                auVar293._24_4_ = 0x3e4cceac;
                auVar293._28_4_ = 0x3e4cceac;
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar150,auVar293);
                auVar294._8_4_ = 0xbe7ffffc;
                auVar294._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar294._12_4_ = 0xbe7ffffc;
                auVar294._16_4_ = 0xbe7ffffc;
                auVar294._20_4_ = 0xbe7ffffc;
                auVar294._24_4_ = 0xbe7ffffc;
                auVar294._28_4_ = 0xbe7ffffc;
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar150,auVar294);
                auVar295._8_4_ = 0x3eaaaaaa;
                auVar295._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar295._12_4_ = 0x3eaaaaaa;
                auVar295._16_4_ = 0x3eaaaaaa;
                auVar295._20_4_ = 0x3eaaaaaa;
                auVar295._24_4_ = 0x3eaaaaaa;
                auVar295._28_4_ = 0x3eaaaaaa;
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar150,auVar295);
                auVar272._0_4_ = auVar259._0_4_ * auVar150._0_4_ * auVar91._0_4_;
                auVar272._4_4_ = auVar259._4_4_ * auVar150._4_4_ * auVar91._4_4_;
                auVar272._8_4_ = auVar259._8_4_ * auVar150._8_4_ * auVar91._8_4_;
                auVar272._12_4_ = auVar259._12_4_ * auVar150._12_4_ * auVar91._12_4_;
                auVar272._16_4_ = auVar259._16_4_ * auVar150._16_4_ * 0.0;
                auVar272._20_4_ = auVar259._20_4_ * auVar150._20_4_ * 0.0;
                auVar272._24_4_ = auVar259._24_4_ * auVar150._24_4_ * 0.0;
                auVar272._28_4_ = 0;
                auVar84 = vcvtdq2ps_avx(auVar239);
                auVar91 = vfmadd231ps_fma(auVar272,auVar84,auVar299);
                auVar91 = vfmsub231ps_fma(ZEXT1632(auVar91),auVar111,auVar259);
                auVar145 = vcmpps_avx(ZEXT1632(auVar90),_DAT_005575c0,2);
                auVar255 = vsubps_avx(ZEXT1632(auVar91),auVar150);
                auVar91 = vfmsub231ps_fma(auVar255,auVar310,auVar84);
                auVar296._8_4_ = 0xc0000000;
                auVar296._0_8_ = 0xc0000000c0000000;
                auVar296._12_4_ = 0xc0000000;
                auVar296._16_4_ = 0xc0000000;
                auVar296._20_4_ = 0xc0000000;
                auVar296._24_4_ = 0xc0000000;
                auVar296._28_4_ = 0xc0000000;
                auVar151._0_4_ = auVar91._0_4_ * -2.0;
                auVar151._4_4_ = auVar91._4_4_ * -2.0;
                auVar151._8_4_ = auVar91._8_4_ * -2.0;
                auVar151._12_4_ = auVar91._12_4_ * -2.0;
                auVar151._16_4_ = 0x80000000;
                auVar151._20_4_ = 0x80000000;
                auVar151._24_4_ = 0x80000000;
                auVar151._28_4_ = 0;
                auVar240._8_4_ = 0x7fffffff;
                auVar240._0_8_ = 0x7fffffff7fffffff;
                auVar240._12_4_ = 0x7fffffff;
                auVar240._16_4_ = 0x7fffffff;
                auVar240._20_4_ = 0x7fffffff;
                auVar240._24_4_ = 0x7fffffff;
                auVar240._28_4_ = 0x7fffffff;
                auVar145 = vblendvps_avx(auVar151,auVar240,auVar145);
                auVar145 = vminps_avx(auVar304,auVar145);
                auVar152._8_4_ = 0xc2b0c0a5;
                auVar152._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar152._12_4_ = 0xc2b0c0a5;
                auVar152._16_4_ = 0xc2b0c0a5;
                auVar152._20_4_ = 0xc2b0c0a5;
                auVar152._24_4_ = 0xc2b0c0a5;
                auVar152._28_4_ = 0xc2b0c0a5;
                auVar84 = vmaxps_avx(auVar145,auVar152);
                auVar153._8_4_ = 0x3fb8aa3b;
                auVar153._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar153._12_4_ = 0x3fb8aa3b;
                auVar153._16_4_ = 0x3fb8aa3b;
                auVar153._20_4_ = 0x3fb8aa3b;
                auVar153._24_4_ = 0x3fb8aa3b;
                auVar153._28_4_ = 0x3fb8aa3b;
                auVar91 = vfmadd213ps_fma(auVar153,auVar84,auVar111);
                auVar255 = vroundps_avx(ZEXT1632(auVar91),1);
                auVar145 = vcmpps_avx(ZEXT1632(auVar91),auVar255,1);
                auVar145 = vandps_avx(auVar79,auVar145);
                auVar145 = vsubps_avx(auVar255,auVar145);
                auVar91 = vfmsub231ps_fma(auVar84,auVar145,auVar310);
                auVar126 = vfnmsub231ps_fma(ZEXT1632(auVar91),auVar145,auVar299);
                auVar84 = ZEXT1632(auVar126);
                auVar19._28_4_ = auVar255._28_4_;
                auVar19._0_28_ =
                     ZEXT1628(CONCAT412(auVar126._12_4_ * auVar126._12_4_,
                                        CONCAT48(auVar126._8_4_ * auVar126._8_4_,
                                                 CONCAT44(auVar126._4_4_ * auVar126._4_4_,
                                                          auVar126._0_4_ * auVar126._0_4_))));
                auVar260._8_4_ = 0x39506967;
                auVar260._0_8_ = 0x3950696739506967;
                auVar260._12_4_ = 0x39506967;
                auVar260._16_4_ = 0x39506967;
                auVar260._20_4_ = 0x39506967;
                auVar260._24_4_ = 0x39506967;
                auVar260._28_4_ = 0x39506967;
                auVar204 = ZEXT3264(auVar79);
                auVar252._8_4_ = 0x3ab743ce;
                auVar252._0_8_ = 0x3ab743ce3ab743ce;
                auVar252._12_4_ = 0x3ab743ce;
                auVar252._16_4_ = 0x3ab743ce;
                auVar252._20_4_ = 0x3ab743ce;
                auVar252._24_4_ = 0x3ab743ce;
                auVar252._28_4_ = 0x3ab743ce;
                auVar91 = vfmadd213ps_fma(auVar260,auVar84,auVar252);
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar84,auVar212);
                auVar213 = ZEXT864(0) << 0x20;
                auVar253._8_4_ = 0x3d2aa9c1;
                auVar253._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar253._12_4_ = 0x3d2aa9c1;
                auVar253._16_4_ = 0x3d2aa9c1;
                auVar253._20_4_ = 0x3d2aa9c1;
                auVar253._24_4_ = 0x3d2aa9c1;
                auVar253._28_4_ = 0x3d2aa9c1;
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar84,auVar253);
                auVar84 = ZEXT1632(auVar126);
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar84,auVar209);
                auVar210 = ZEXT3264(auVar111);
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar84,auVar111);
                auVar90 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar19,auVar84);
                auVar92._0_4_ = (int)auVar145._0_4_;
                auVar92._4_4_ = (int)auVar145._4_4_;
                auVar92._8_4_ = (int)auVar145._8_4_;
                auVar92._12_4_ = (int)auVar145._12_4_;
                auVar116._16_4_ = (int)auVar145._16_4_;
                auVar116._0_16_ = auVar92;
                auVar116._20_4_ = (int)auVar145._20_4_;
                auVar116._24_4_ = (int)auVar145._24_4_;
                auVar116._28_4_ = (int)auVar145._28_4_;
                auVar126 = vpslld_avx(auVar92,0x17);
                auVar91 = vpslld_avx(auVar116._16_16_,0x17);
                auVar91 = vpaddd_avx(auVar91,auVar162);
                auVar126 = vpaddd_avx(auVar126,auVar162);
                auVar117._16_16_ = auVar91;
                auVar117._0_16_ = auVar126;
                auVar154._0_4_ = auVar90._0_4_ + fVar66;
                auVar154._4_4_ = auVar90._4_4_ + fVar65;
                auVar154._8_4_ = auVar90._8_4_ + fVar3;
                auVar154._12_4_ = auVar90._12_4_ + fVar125;
                auVar154._16_4_ = fVar14 + 0.0;
                auVar154._20_4_ = fVar15 + 0.0;
                auVar154._24_4_ = fVar16 + 0.0;
                auVar154._28_4_ = fVar17 + 0.0;
                auVar91 = vfmadd213ps_fma(auVar117,auVar154,auVar79);
                auVar111 = vrcpps_avx(ZEXT1632(auVar91));
                auVar91 = vfmsub213ps_fma(ZEXT1632(auVar91),auVar111,auVar79);
                auVar91 = vfnmadd132ps_fma(ZEXT1632(auVar91),auVar111,auVar111);
                auVar91 = vfnmadd213ps_fma(ZEXT1632(auVar91),auVar296,auVar200);
                auVar110 = ZEXT1628(auVar91);
                goto LAB_004fd84a;
              case 6:
                uVar2 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var7);
                auVar123._4_4_ = uVar2;
                auVar123._0_4_ = uVar2;
                auVar123._8_4_ = uVar2;
                auVar123._12_4_ = uVar2;
                auVar123._16_4_ = uVar2;
                auVar123._20_4_ = uVar2;
                auVar123._24_4_ = uVar2;
                auVar123._28_4_ = uVar2;
                uVar2 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var7))[1];
                auVar158._4_4_ = uVar2;
                auVar158._0_4_ = uVar2;
                auVar158._8_4_ = uVar2;
                auVar158._12_4_ = uVar2;
                auVar158._16_4_ = uVar2;
                auVar158._20_4_ = uVar2;
                auVar158._24_4_ = uVar2;
                auVar158._28_4_ = uVar2;
                auVar91 = vfmadd231ps_fma(auVar158,auVar82,auVar123);
                auVar111 = vmaxps_avx(ZEXT1632(auVar91),auVar145);
                auVar79 = vminps_avx(auVar111,auVar79);
                auVar110 = auVar79._0_28_;
LAB_004fd84a:
                auVar82._4_4_ = auVar110._4_4_ * fVar89;
                auVar82._0_4_ = auVar110._0_4_ * fVar64;
                auVar82._8_4_ = auVar110._8_4_ * auVar82._8_4_;
                auVar82._12_4_ = auVar110._12_4_ * auVar82._12_4_;
                auVar82._16_4_ = auVar110._16_4_ * auVar82._16_4_;
                auVar82._20_4_ = auVar110._20_4_ * auVar82._20_4_;
                auVar82._24_4_ = auVar110._24_4_ * auVar82._24_4_;
              }
              auVar126 = auVar82._16_16_;
              auVar91 = auVar82._0_16_;
              if (iVar53 == 1) {
                *(int *)*local_1d0 = auVar82._0_4_;
                uVar2 = vextractps_avx(auVar91,1);
                *(undefined4 *)((long)*local_1d0 + lVar58 * 4) = uVar2;
                uVar2 = vextractps_avx(auVar91,2);
                *(undefined4 *)((long)*local_1d0 + (long)(iVar57 * 2) * 4) = uVar2;
                uVar2 = vextractps_avx(auVar91,3);
                *(undefined4 *)((long)*local_1d0 + (long)(iVar57 * 3) * 4) = uVar2;
                *(int *)((long)*local_1d0 + (long)(iVar57 * 4) * 4) = auVar82._16_4_;
                uVar2 = vextractps_avx(auVar126,1);
                *(undefined4 *)((long)*local_1d0 + (long)(iVar57 * 5) * 4) = uVar2;
                uVar2 = vextractps_avx(auVar126,2);
                *(undefined4 *)((long)*local_1d0 + (long)(iVar57 * 6) * 4) = uVar2;
                uVar2 = vextractps_avx(auVar126,3);
                *(undefined4 *)((long)*local_1d0 + (long)(iVar57 * 7) * 4) = uVar2;
                local_1d0 = (undefined1 (*) [32])((long)*local_1d0 + 4);
              }
              else if (iVar53 == 4) {
                *(undefined1 (*) [16])*local_1d0 = auVar91;
                *(undefined1 (*) [16])((long)*local_1d0 + lVar58 * 4) = auVar126;
                local_1d0 = (undefined1 (*) [32])((long)*local_1d0 + 0x10);
              }
              else if (iVar53 == 8) {
                *local_1d0 = auVar82;
                local_1d0 = local_1d0 + 1;
              }
              lVar33 = local_1a8._0_8_ + 1;
              iVar43 = iVar43 + iVar47 * local_c8.elempack;
              local_150 = local_150 + lVar31 * 4;
              local_118._0_8_ = local_118._0_8_ + lVar31 * 4;
              local_1a8._0_8_ = lVar33;
            } while (lVar33 != lVar32);
          }
          local_1f8 = local_1f8 + 1;
        } while (local_1f8 != uVar50);
      }
      iVar43 = iVar29 + uVar50 * -8;
      iVar53 = iVar43 + 3;
      if (-1 < iVar43) {
        iVar53 = iVar43;
      }
      if (3 < iVar43) {
        auVar204 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar203._8_4_ = 0x3f000000;
        auVar203._0_8_ = 0x3f0000003f000000;
        auVar203._12_4_ = 0x3f000000;
        auVar205._8_4_ = 0x3f800000;
        auVar205._0_8_ = 0x3f8000003f800000;
        auVar205._12_4_ = 0x3f800000;
        local_170 = 0;
        auVar297._8_4_ = 0xc2b0c0a5;
        auVar297._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar297._12_4_ = 0xc2b0c0a5;
        auVar300._8_4_ = 0x3ab743ce;
        auVar300._0_8_ = 0x3ab743ce3ab743ce;
        auVar300._12_4_ = 0x3ab743ce;
        auVar211._8_4_ = 0x3e2aaaaa;
        auVar211._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar211._12_4_ = 0x3e2aaaaa;
        do {
          lVar58 = (long)top_blob->w;
          if (0 < lVar58) {
            uVar27 = local_c8.h * local_c8.elempack;
            iVar43 = top_blob->elempack;
            uVar34 = (long)(int)(uVar50 * 8) + local_170 * 4;
            uVar51 = (uint)uVar34;
            local_188 = (undefined1 (*) [16])
                        ((int)((long)((ulong)(uint)((int)uVar51 >> 0x1f) << 0x20 |
                                     uVar34 & 0xffffffff) / (long)iVar43) * lVar58 *
                         top_blob->elemsize + (long)top_blob->data);
            uVar48 = uVar51 + 7;
            if (-1 < (int)uVar51) {
              uVar48 = uVar51;
            }
            auVar22._8_8_ = 0;
            auVar22._0_8_ = local_118._8_8_;
            local_118 = auVar22 << 0x40;
            iVar42 = 0;
            lVar32 = 0;
            local_150 = lVar60 * 4;
            do {
              auVar210 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar91 = ZEXT816(0) << 0x40;
              if (lVar8 != 0) {
                auVar91 = *(undefined1 (*) [16])(lVar8 + uVar34 * 4);
              }
              auVar213 = ZEXT1664(auVar91);
              pauVar62 = (undefined1 (*) [16])
                         ((this->weight_data_tm).cstep *
                          (long)(((int)(uVar51 - (uVar48 & 0xfffffff8)) >> 2) + ((int)uVar48 >> 3))
                          * (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
              if ((int)uVar27 < 8) {
                auVar88 = ZEXT864(0);
                auVar305 = ZEXT864(0);
                uVar28 = 0;
              }
              else {
                auVar305 = ZEXT864(0);
                auVar88 = ZEXT864(0);
                iVar41 = 0;
                do {
                  lVar33 = (long)(iVar41 / local_c8.elempack) * (long)local_c8.w * local_c8.elemsize
                  ;
                  if (local_c8.elempack == 8) {
                    if (0 < iVar5) {
                      puVar54 = (undefined4 *)
                                ((long)(_func_int ***)local_c8.data + lVar33 + (long)iVar42 * 4);
                      iVar44 = iVar5;
                      do {
                        uVar2 = *puVar54;
                        auVar163._4_4_ = uVar2;
                        auVar163._0_4_ = uVar2;
                        auVar163._8_4_ = uVar2;
                        auVar163._12_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar163,auVar213._0_16_,*pauVar62);
                        uVar2 = puVar54[1];
                        auVar242._4_4_ = uVar2;
                        auVar242._0_4_ = uVar2;
                        auVar242._8_4_ = uVar2;
                        auVar242._12_4_ = uVar2;
                        auVar126 = vfmadd132ps_fma(auVar242,auVar305._0_16_,pauVar62[1]);
                        uVar2 = puVar54[2];
                        auVar261._4_4_ = uVar2;
                        auVar261._0_4_ = uVar2;
                        auVar261._8_4_ = uVar2;
                        auVar261._12_4_ = uVar2;
                        auVar90 = vfmadd132ps_fma(auVar261,auVar88._0_16_,pauVar62[2]);
                        uVar2 = puVar54[3];
                        auVar274._4_4_ = uVar2;
                        auVar274._0_4_ = uVar2;
                        auVar274._8_4_ = uVar2;
                        auVar274._12_4_ = uVar2;
                        auVar92 = vfmadd132ps_fma(auVar274,auVar210._0_16_,pauVar62[3]);
                        uVar2 = puVar54[4];
                        auVar214._4_4_ = uVar2;
                        auVar214._0_4_ = uVar2;
                        auVar214._8_4_ = uVar2;
                        auVar214._12_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar214,auVar91,pauVar62[4]);
                        auVar213 = ZEXT1664(auVar91);
                        uVar2 = puVar54[5];
                        auVar306._4_4_ = uVar2;
                        auVar306._0_4_ = uVar2;
                        auVar306._8_4_ = uVar2;
                        auVar306._12_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar306,auVar126,pauVar62[5]);
                        auVar305 = ZEXT1664(auVar91);
                        uVar2 = puVar54[6];
                        auVar128._4_4_ = uVar2;
                        auVar128._0_4_ = uVar2;
                        auVar128._8_4_ = uVar2;
                        auVar128._12_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar128,auVar90,pauVar62[6]);
                        auVar88 = ZEXT1664(auVar91);
                        uVar2 = puVar54[7];
                        auVar93._4_4_ = uVar2;
                        auVar93._0_4_ = uVar2;
                        auVar93._8_4_ = uVar2;
                        auVar93._12_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar93,auVar92,pauVar62[7]);
                        auVar210 = ZEXT1664(auVar91);
                        pauVar62 = pauVar62 + 8;
                        puVar54 = puVar54 + iVar6 * 8;
                        iVar44 = iVar44 + -1;
                      } while (iVar44 != 0);
                      goto LAB_004fdd08;
                    }
                  }
                  else {
                    puVar54 = (undefined4 *)
                              ((long)(_func_int ***)local_c8.data +
                              lVar33 + (long)(local_c8.elempack * iVar47 * (int)lVar32) * 4);
LAB_004fdd08:
                    if (local_c8.elempack == 4) {
                      iVar44 = iVar5;
                      if (iVar5 < 1) goto LAB_004fde05;
                      do {
                        uVar2 = *puVar54;
                        auVar164._4_4_ = uVar2;
                        auVar164._0_4_ = uVar2;
                        auVar164._8_4_ = uVar2;
                        auVar164._12_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar164,auVar213._0_16_,*pauVar62);
                        uVar2 = puVar54[1];
                        auVar243._4_4_ = uVar2;
                        auVar243._0_4_ = uVar2;
                        auVar243._8_4_ = uVar2;
                        auVar243._12_4_ = uVar2;
                        auVar126 = vfmadd132ps_fma(auVar243,auVar305._0_16_,pauVar62[1]);
                        uVar2 = puVar54[2];
                        auVar262._4_4_ = uVar2;
                        auVar262._0_4_ = uVar2;
                        auVar262._8_4_ = uVar2;
                        auVar262._12_4_ = uVar2;
                        auVar90 = vfmadd132ps_fma(auVar262,auVar88._0_16_,pauVar62[2]);
                        uVar2 = puVar54[3];
                        auVar275._4_4_ = uVar2;
                        auVar275._0_4_ = uVar2;
                        auVar275._8_4_ = uVar2;
                        auVar275._12_4_ = uVar2;
                        auVar92 = vfmadd132ps_fma(auVar275,auVar210._0_16_,pauVar62[3]);
                        uVar2 = puVar54[lVar60];
                        auVar215._4_4_ = uVar2;
                        auVar215._0_4_ = uVar2;
                        auVar215._8_4_ = uVar2;
                        auVar215._12_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar215,auVar91,pauVar62[4]);
                        auVar213 = ZEXT1664(auVar91);
                        uVar2 = puVar54[lVar60 + 1];
                        auVar307._4_4_ = uVar2;
                        auVar307._0_4_ = uVar2;
                        auVar307._8_4_ = uVar2;
                        auVar307._12_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar307,auVar126,pauVar62[5]);
                        auVar305 = ZEXT1664(auVar91);
                        uVar2 = puVar54[lVar60 + 2];
                        auVar129._4_4_ = uVar2;
                        auVar129._0_4_ = uVar2;
                        auVar129._8_4_ = uVar2;
                        auVar129._12_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar129,auVar90,pauVar62[6]);
                        auVar88 = ZEXT1664(auVar91);
                        uVar2 = puVar54[lVar60 + 3];
                        auVar94._4_4_ = uVar2;
                        auVar94._0_4_ = uVar2;
                        auVar94._8_4_ = uVar2;
                        auVar94._12_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar94,auVar92,pauVar62[7]);
                        auVar210 = ZEXT1664(auVar91);
                        pauVar62 = pauVar62 + 8;
                        puVar54 = puVar54 + iVar6 * 4;
                        iVar44 = iVar44 + -1;
                      } while (iVar44 != 0);
                    }
                    if ((local_c8.elempack == 1) && (iVar44 = iVar5, 0 < iVar5)) {
                      do {
                        uVar2 = *puVar54;
                        auVar165._4_4_ = uVar2;
                        auVar165._0_4_ = uVar2;
                        auVar165._8_4_ = uVar2;
                        auVar165._12_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar165,auVar213._0_16_,*pauVar62);
                        uVar2 = puVar54[lVar60];
                        auVar244._4_4_ = uVar2;
                        auVar244._0_4_ = uVar2;
                        auVar244._8_4_ = uVar2;
                        auVar244._12_4_ = uVar2;
                        auVar126 = vfmadd132ps_fma(auVar244,auVar305._0_16_,pauVar62[1]);
                        uVar2 = puVar54[iVar26 * 2];
                        auVar263._4_4_ = uVar2;
                        auVar263._0_4_ = uVar2;
                        auVar263._8_4_ = uVar2;
                        auVar263._12_4_ = uVar2;
                        auVar90 = vfmadd132ps_fma(auVar263,auVar88._0_16_,pauVar62[2]);
                        uVar2 = puVar54[iVar26 * 3];
                        auVar276._4_4_ = uVar2;
                        auVar276._0_4_ = uVar2;
                        auVar276._8_4_ = uVar2;
                        auVar276._12_4_ = uVar2;
                        auVar92 = vfmadd132ps_fma(auVar276,auVar210._0_16_,pauVar62[3]);
                        uVar2 = puVar54[iVar26 * 4];
                        auVar216._4_4_ = uVar2;
                        auVar216._0_4_ = uVar2;
                        auVar216._8_4_ = uVar2;
                        auVar216._12_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar216,auVar91,pauVar62[4]);
                        auVar213 = ZEXT1664(auVar91);
                        uVar2 = puVar54[iVar26 * 5];
                        auVar308._4_4_ = uVar2;
                        auVar308._0_4_ = uVar2;
                        auVar308._8_4_ = uVar2;
                        auVar308._12_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar308,auVar126,pauVar62[5]);
                        auVar305 = ZEXT1664(auVar91);
                        uVar2 = puVar54[iVar26 * 6];
                        auVar130._4_4_ = uVar2;
                        auVar130._0_4_ = uVar2;
                        auVar130._8_4_ = uVar2;
                        auVar130._12_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar130,auVar90,pauVar62[6]);
                        auVar88 = ZEXT1664(auVar91);
                        uVar2 = puVar54[iVar26 * 7];
                        auVar95._4_4_ = uVar2;
                        auVar95._0_4_ = uVar2;
                        auVar95._8_4_ = uVar2;
                        auVar95._12_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar95,auVar92,pauVar62[7]);
                        auVar210 = ZEXT1664(auVar91);
                        pauVar62 = pauVar62 + 8;
                        puVar54 = puVar54 + lVar30;
                        iVar44 = iVar44 + -1;
                      } while (iVar44 != 0);
                    }
                  }
LAB_004fde05:
                  iVar44 = iVar41 + 0xf;
                  uVar28 = uVar27 & 0xfffffff8;
                  iVar41 = iVar41 + 8;
                } while (iVar44 < (int)uVar27);
              }
              auVar126 = auVar88._0_16_;
              auVar91 = auVar210._0_16_;
              if ((int)(uVar28 | 3) < (int)uVar27) {
                uVar52 = uVar28;
                do {
                  lVar33 = (long)((int)uVar52 / local_c8.elempack) *
                           (long)local_c8.w * local_c8.elemsize;
                  if (local_c8.elempack == 4) {
                    if (0 < iVar5) {
                      puVar54 = (undefined4 *)
                                ((long)(_func_int ***)local_c8.data + lVar33 + (long)iVar42 * 4);
                      iVar41 = iVar5;
                      do {
                        uVar2 = *puVar54;
                        auVar166._4_4_ = uVar2;
                        auVar166._0_4_ = uVar2;
                        auVar166._8_4_ = uVar2;
                        auVar166._12_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar213._0_16_,auVar166,*pauVar62);
                        auVar213 = ZEXT1664(auVar91);
                        uVar2 = puVar54[1];
                        auVar167._4_4_ = uVar2;
                        auVar167._0_4_ = uVar2;
                        auVar167._8_4_ = uVar2;
                        auVar167._12_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar305._0_16_,auVar167,pauVar62[1]);
                        auVar305 = ZEXT1664(auVar91);
                        uVar2 = puVar54[2];
                        auVar168._4_4_ = uVar2;
                        auVar168._0_4_ = uVar2;
                        auVar168._8_4_ = uVar2;
                        auVar168._12_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar88._0_16_,auVar168,pauVar62[2]);
                        auVar88 = ZEXT1664(auVar91);
                        uVar2 = puVar54[3];
                        auVar169._4_4_ = uVar2;
                        auVar169._0_4_ = uVar2;
                        auVar169._8_4_ = uVar2;
                        auVar169._12_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar210._0_16_,auVar169,pauVar62[3]);
                        auVar210 = ZEXT1664(auVar91);
                        pauVar62 = pauVar62 + 4;
                        puVar54 = puVar54 + iVar6 * 4;
                        iVar41 = iVar41 + -1;
                      } while (iVar41 != 0);
                      goto LAB_004fdecf;
                    }
                  }
                  else {
                    puVar54 = (undefined4 *)
                              ((long)(_func_int ***)local_c8.data +
                              lVar33 + (long)(local_c8.elempack * iVar47 * (int)lVar32) * 4);
LAB_004fdecf:
                    if ((local_c8.elempack == 1) && (iVar41 = iVar5, 0 < iVar5)) {
                      do {
                        uVar2 = *puVar54;
                        auVar170._4_4_ = uVar2;
                        auVar170._0_4_ = uVar2;
                        auVar170._8_4_ = uVar2;
                        auVar170._12_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar213._0_16_,auVar170,*pauVar62);
                        auVar213 = ZEXT1664(auVar91);
                        uVar2 = puVar54[lVar60];
                        auVar171._4_4_ = uVar2;
                        auVar171._0_4_ = uVar2;
                        auVar171._8_4_ = uVar2;
                        auVar171._12_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar305._0_16_,auVar171,pauVar62[1]);
                        auVar305 = ZEXT1664(auVar91);
                        uVar2 = puVar54[iVar26 * 2];
                        auVar172._4_4_ = uVar2;
                        auVar172._0_4_ = uVar2;
                        auVar172._8_4_ = uVar2;
                        auVar172._12_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar88._0_16_,auVar172,pauVar62[2]);
                        auVar88 = ZEXT1664(auVar91);
                        uVar2 = puVar54[iVar26 * 3];
                        auVar173._4_4_ = uVar2;
                        auVar173._0_4_ = uVar2;
                        auVar173._8_4_ = uVar2;
                        auVar173._12_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar210._0_16_,auVar173,pauVar62[3]);
                        auVar210 = ZEXT1664(auVar91);
                        pauVar62 = pauVar62 + 4;
                        puVar54 = puVar54 + lVar30;
                        iVar41 = iVar41 + -1;
                      } while (iVar41 != 0);
                    }
                  }
                  auVar126 = auVar88._0_16_;
                  auVar91 = auVar210._0_16_;
                  uVar28 = uVar52 + 4;
                  iVar41 = uVar52 + 7;
                  uVar52 = uVar28;
                } while (iVar41 < (int)uVar27);
              }
              auVar90 = auVar305._0_16_;
              uVar35 = (ulong)uVar28;
              if ((int)(uVar28 | 1) < (int)uVar27) {
                lVar38 = (long)local_c8.w * local_c8.elemsize * uVar35;
                lVar49 = (long)(_func_int ***)local_c8.data + lVar38 + local_150;
                lVar33 = (long)local_c8.w * local_c8.elemsize * 2;
                lVar38 = (long)(_func_int ***)local_c8.data + lVar38 + local_118._0_8_;
                do {
                  if (0 < iVar5) {
                    lVar39 = 0;
                    iVar41 = iVar5;
                    do {
                      uVar2 = *(undefined4 *)(lVar38 + lVar39);
                      auVar174._4_4_ = uVar2;
                      auVar174._0_4_ = uVar2;
                      auVar174._8_4_ = uVar2;
                      auVar174._12_4_ = uVar2;
                      auVar90 = vfmadd231ps_fma(auVar213._0_16_,auVar174,*pauVar62);
                      auVar213 = ZEXT1664(auVar90);
                      uVar2 = *(undefined4 *)(lVar49 + lVar39);
                      auVar175._4_4_ = uVar2;
                      auVar175._0_4_ = uVar2;
                      auVar175._8_4_ = uVar2;
                      auVar175._12_4_ = uVar2;
                      auVar90 = vfmadd231ps_fma(auVar305._0_16_,auVar175,pauVar62[1]);
                      auVar305 = ZEXT1664(auVar90);
                      pauVar62 = pauVar62 + 2;
                      lVar39 = lVar39 + lVar30 * 4;
                      iVar41 = iVar41 + -1;
                    } while (iVar41 != 0);
                  }
                  auVar90 = auVar305._0_16_;
                  uVar35 = uVar35 + 2;
                  uVar28 = (uint)uVar35;
                  lVar49 = lVar49 + lVar33;
                  lVar38 = lVar38 + lVar33;
                } while ((int)(uVar28 | 1) < (int)uVar27);
              }
              auVar92 = auVar213._0_16_;
              if ((int)uVar28 < (int)uVar27) {
                uVar35 = (ulong)uVar28;
                puVar54 = (undefined4 *)
                          ((long)(_func_int ***)local_c8.data +
                          (long)local_c8.w * local_c8.elemsize * uVar35 + local_118._0_8_);
                do {
                  puVar59 = puVar54;
                  iVar41 = iVar5;
                  if (0 < iVar5) {
                    do {
                      uVar2 = *puVar59;
                      auVar176._4_4_ = uVar2;
                      auVar176._0_4_ = uVar2;
                      auVar176._8_4_ = uVar2;
                      auVar176._12_4_ = uVar2;
                      auVar92 = vfmadd231ps_fma(auVar213._0_16_,auVar176,*pauVar62);
                      auVar213 = ZEXT1664(auVar92);
                      pauVar62 = pauVar62 + 1;
                      puVar59 = puVar59 + lVar30;
                      iVar41 = iVar41 + -1;
                    } while (iVar41 != 0);
                  }
                  auVar92 = auVar213._0_16_;
                  uVar35 = uVar35 + 1;
                  puVar54 = (undefined4 *)((long)puVar54 + (long)local_c8.w * local_c8.elemsize);
                } while ((int)uVar35 < (int)uVar27);
              }
              auVar96._0_4_ = auVar126._0_4_ + auVar91._0_4_ + auVar90._0_4_ + auVar92._0_4_;
              auVar96._4_4_ = auVar126._4_4_ + auVar91._4_4_ + auVar90._4_4_ + auVar92._4_4_;
              auVar96._8_4_ = auVar126._8_4_ + auVar91._8_4_ + auVar90._8_4_ + auVar92._8_4_;
              auVar96._12_4_ = auVar126._12_4_ + auVar91._12_4_ + auVar90._12_4_ + auVar92._12_4_;
              auVar91 = auVar204._0_16_;
              switch(uVar37) {
              case 1:
                auVar96 = vmaxps_avx(auVar91,auVar96);
                break;
              case 2:
                auVar126 = vmaxps_avx(auVar91,auVar96);
                auVar91 = vminps_avx(auVar91,auVar96);
                uVar2 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var7);
                auVar99._4_4_ = uVar2;
                auVar99._0_4_ = uVar2;
                auVar99._8_4_ = uVar2;
                auVar99._12_4_ = uVar2;
                auVar96 = vfmadd213ps_fma(auVar99,auVar91,auVar126);
                break;
              case 3:
                uVar2 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var7);
                auVar133._4_4_ = uVar2;
                auVar133._0_4_ = uVar2;
                auVar133._8_4_ = uVar2;
                auVar133._12_4_ = uVar2;
                uVar2 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var7))[1];
                auVar183._4_4_ = uVar2;
                auVar183._0_4_ = uVar2;
                auVar183._8_4_ = uVar2;
                auVar183._12_4_ = uVar2;
                auVar91 = vmaxps_avx(auVar96,auVar133);
                auVar96 = vminps_avx(auVar91,auVar183);
                break;
              case 4:
                uVar35 = CONCAT44(auVar96._4_4_,auVar96._0_4_);
                auVar97._0_8_ = uVar35 ^ 0x8000000080000000;
                auVar97._8_4_ = -auVar96._8_4_;
                auVar97._12_4_ = -auVar96._12_4_;
                auVar134._8_4_ = 0x42b0c0a5;
                auVar134._0_8_ = 0x42b0c0a542b0c0a5;
                auVar134._12_4_ = 0x42b0c0a5;
                auVar91 = vminps_avx(auVar97,auVar134);
                auVar135._8_4_ = 0xc2b0c0a5;
                auVar135._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar135._12_4_ = 0xc2b0c0a5;
                auVar90 = vmaxps_avx(auVar91,auVar135);
                auVar136._8_4_ = 0x3fb8aa3b;
                auVar136._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar136._12_4_ = 0x3fb8aa3b;
                auVar91 = vfmadd213ps_fma(auVar136,auVar90,auVar203);
                auVar184._0_4_ = (int)auVar91._0_4_;
                auVar184._4_4_ = (int)auVar91._4_4_;
                auVar184._8_4_ = (int)auVar91._8_4_;
                auVar184._12_4_ = (int)auVar91._12_4_;
                auVar126 = vcvtdq2ps_avx(auVar184);
                auVar91 = vcmpps_avx(auVar91,auVar126,1);
                auVar91 = vandps_avx(auVar91,auVar205);
                auVar91 = vsubps_avx(auVar126,auVar91);
                auVar71._8_4_ = 0x3f318000;
                auVar71._0_8_ = 0x3f3180003f318000;
                auVar71._12_4_ = 0x3f318000;
                auVar126 = vfmsub231ps_fma(auVar90,auVar91,auVar71);
                auVar185._8_4_ = 0x395e8083;
                auVar185._0_8_ = 0x395e8083395e8083;
                auVar185._12_4_ = 0x395e8083;
                auVar90 = vfmsub231ps_fma(auVar126,auVar91,auVar185);
                auVar186._0_4_ = auVar90._0_4_ * auVar90._0_4_;
                auVar186._4_4_ = auVar90._4_4_ * auVar90._4_4_;
                auVar186._8_4_ = auVar90._8_4_ * auVar90._8_4_;
                auVar186._12_4_ = auVar90._12_4_ * auVar90._12_4_;
                auVar224._8_4_ = 0x39506967;
                auVar224._0_8_ = 0x3950696739506967;
                auVar224._12_4_ = 0x39506967;
                auVar251._8_4_ = 0x3ab743ce;
                auVar251._0_8_ = 0x3ab743ce3ab743ce;
                auVar251._12_4_ = 0x3ab743ce;
                auVar126 = vfmadd213ps_fma(auVar224,auVar90,auVar251);
                auVar197._8_4_ = 0x3c088908;
                auVar197._0_8_ = 0x3c0889083c088908;
                auVar197._12_4_ = 0x3c088908;
                auVar126 = vfmadd213ps_fma(auVar126,auVar90,auVar197);
                auVar72._8_4_ = 0x3d2aa9c1;
                auVar72._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar72._12_4_ = 0x3d2aa9c1;
                auVar126 = vfmadd213ps_fma(auVar126,auVar90,auVar72);
                auVar73._8_4_ = 0x3e2aaaaa;
                auVar73._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar73._12_4_ = 0x3e2aaaaa;
                auVar126 = vfmadd213ps_fma(auVar126,auVar90,auVar73);
                auVar126 = vfmadd213ps_fma(auVar126,auVar90,auVar203);
                auVar126 = vfmadd213ps_fma(auVar126,auVar186,auVar90);
                auVar187._0_4_ = auVar126._0_4_ + 1.0;
                auVar187._4_4_ = auVar126._4_4_ + 1.0;
                auVar187._8_4_ = auVar126._8_4_ + 1.0;
                auVar187._12_4_ = auVar126._12_4_ + 1.0;
                auVar98._0_4_ = (int)auVar91._0_4_;
                auVar98._4_4_ = (int)auVar91._4_4_;
                auVar98._8_4_ = (int)auVar91._8_4_;
                auVar98._12_4_ = (int)auVar91._12_4_;
                auVar91 = vpslld_avx(auVar98,0x17);
                auVar91 = vpaddd_avx(auVar91,auVar205);
                auVar126 = vfmadd213ps_fma(auVar91,auVar187,auVar205);
                auVar91 = vrcpps_avx(auVar126);
                auVar126 = vfmsub213ps_fma(auVar126,auVar91,auVar205);
                auVar96 = vfnmadd132ps_fma(auVar126,auVar91,auVar91);
                break;
              case 5:
                auVar309._8_4_ = 0x42b0c0a5;
                auVar309._0_8_ = 0x42b0c0a542b0c0a5;
                auVar309._12_4_ = 0x42b0c0a5;
                auVar91 = vminps_avx(auVar309,auVar96);
                auVar90 = vmaxps_avx(auVar297,auVar91);
                auVar177._8_4_ = 0x3fb8aa3b;
                auVar177._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar177._12_4_ = 0x3fb8aa3b;
                auVar91 = vfmadd213ps_fma(auVar177,auVar90,auVar203);
                auVar217._0_4_ = (int)auVar91._0_4_;
                auVar217._4_4_ = (int)auVar91._4_4_;
                auVar217._8_4_ = (int)auVar91._8_4_;
                auVar217._12_4_ = (int)auVar91._12_4_;
                auVar126 = vcvtdq2ps_avx(auVar217);
                auVar91 = vcmpps_avx(auVar91,auVar126,1);
                auVar91 = vandps_avx(auVar91,auVar205);
                auVar91 = vsubps_avx(auVar126,auVar91);
                auVar68._8_4_ = 0x3f318000;
                auVar68._0_8_ = 0x3f3180003f318000;
                auVar68._12_4_ = 0x3f318000;
                auVar126 = vfmsub231ps_fma(auVar90,auVar91,auVar68);
                auVar254._8_4_ = 0xb95e8083;
                auVar254._0_8_ = 0xb95e8083b95e8083;
                auVar254._12_4_ = 0xb95e8083;
                auVar90 = vfnmsub231ps_fma(auVar126,auVar91,auVar254);
                auVar218._0_4_ = auVar90._0_4_ * auVar90._0_4_;
                auVar218._4_4_ = auVar90._4_4_ * auVar90._4_4_;
                auVar218._8_4_ = auVar90._8_4_ * auVar90._8_4_;
                auVar218._12_4_ = auVar90._12_4_ * auVar90._12_4_;
                auVar245._8_4_ = 0x39506967;
                auVar245._0_8_ = 0x3950696739506967;
                auVar245._12_4_ = 0x39506967;
                auVar126 = vfmadd213ps_fma(auVar245,auVar90,auVar300);
                auVar195._8_4_ = 0x3c088908;
                auVar195._0_8_ = 0x3c0889083c088908;
                auVar195._12_4_ = 0x3c088908;
                auVar126 = vfmadd213ps_fma(auVar126,auVar90,auVar195);
                auVar196._8_4_ = 0x3d2aa9c1;
                auVar196._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar196._12_4_ = 0x3d2aa9c1;
                auVar126 = vfmadd213ps_fma(auVar126,auVar90,auVar196);
                auVar126 = vfmadd213ps_fma(auVar126,auVar90,auVar211);
                auVar126 = vfmadd213ps_fma(auVar126,auVar90,auVar203);
                auVar126 = vfmadd213ps_fma(auVar126,auVar218,auVar90);
                auVar219._0_4_ = auVar126._0_4_ + 1.0;
                auVar219._4_4_ = auVar126._4_4_ + 1.0;
                auVar219._8_4_ = auVar126._8_4_ + 1.0;
                auVar219._12_4_ = auVar126._12_4_ + 1.0;
                auVar131._0_4_ = (int)auVar91._0_4_;
                auVar131._4_4_ = (int)auVar91._4_4_;
                auVar131._8_4_ = (int)auVar91._8_4_;
                auVar131._12_4_ = (int)auVar91._12_4_;
                auVar91 = vpslld_avx(auVar131,0x17);
                auVar91 = vpaddd_avx(auVar91,auVar205);
                auVar162 = vfmadd213ps_fma(auVar91,auVar219,auVar205);
                auVar178._8_4_ = 0x800000;
                auVar178._0_8_ = 0x80000000800000;
                auVar178._12_4_ = 0x800000;
                auVar91 = vmaxps_avx(auVar162,auVar178);
                auVar126 = vpsrld_avx(auVar91,0x17);
                auVar246._8_4_ = 0xffffff82;
                auVar246._0_8_ = 0xffffff82ffffff82;
                auVar246._12_4_ = 0xffffff82;
                auVar126 = vpaddd_avx(auVar126,auVar246);
                auVar247._8_4_ = 0x807fffff;
                auVar247._0_8_ = 0x807fffff807fffff;
                auVar247._12_4_ = 0x807fffff;
                auVar91 = vandps_avx(auVar247,auVar91);
                auVar92 = vorps_avx(auVar91,auVar203);
                auVar90 = vcvtdq2ps_avx(auVar126);
                auVar248._8_4_ = 0x3f3504f3;
                auVar248._0_8_ = 0x3f3504f33f3504f3;
                auVar248._12_4_ = 0x3f3504f3;
                auVar126 = vcmpps_avx(auVar92,auVar248,1);
                auVar91 = vandps_avx(auVar126,auVar92);
                auVar179._0_4_ = auVar91._0_4_ + auVar92._0_4_ + -1.0;
                auVar179._4_4_ = auVar91._4_4_ + auVar92._4_4_ + -1.0;
                auVar179._8_4_ = auVar91._8_4_ + auVar92._8_4_ + -1.0;
                auVar179._12_4_ = auVar91._12_4_ + auVar92._12_4_ + -1.0;
                auVar91 = vandps_avx(auVar126,auVar205);
                auVar126 = vsubps_avx(auVar90,auVar91);
                auVar249._0_4_ = auVar179._0_4_ * auVar179._0_4_;
                auVar249._4_4_ = auVar179._4_4_ * auVar179._4_4_;
                auVar249._8_4_ = auVar179._8_4_ * auVar179._8_4_;
                auVar249._12_4_ = auVar179._12_4_ * auVar179._12_4_;
                auVar264._8_4_ = 0x3d9021bb;
                auVar264._0_8_ = 0x3d9021bb3d9021bb;
                auVar264._12_4_ = 0x3d9021bb;
                auVar277._8_4_ = 0xbdebd1b8;
                auVar277._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar277._12_4_ = 0xbdebd1b8;
                auVar91 = vfmadd213ps_fma(auVar264,auVar179,auVar277);
                auVar278._8_4_ = 0x3def251a;
                auVar278._0_8_ = 0x3def251a3def251a;
                auVar278._12_4_ = 0x3def251a;
                auVar91 = vfmadd213ps_fma(auVar91,auVar179,auVar278);
                auVar279._8_4_ = 0xbdfe5d4f;
                auVar279._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar279._12_4_ = 0xbdfe5d4f;
                auVar91 = vfmadd213ps_fma(auVar91,auVar179,auVar279);
                auVar280._8_4_ = 0x3e11e9bf;
                auVar280._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar280._12_4_ = 0x3e11e9bf;
                auVar91 = vfmadd213ps_fma(auVar91,auVar179,auVar280);
                auVar281._8_4_ = 0xbe2aae50;
                auVar281._0_8_ = 0xbe2aae50be2aae50;
                auVar281._12_4_ = 0xbe2aae50;
                auVar91 = vfmadd213ps_fma(auVar91,auVar179,auVar281);
                auVar282._8_4_ = 0x3e4cceac;
                auVar282._0_8_ = 0x3e4cceac3e4cceac;
                auVar282._12_4_ = 0x3e4cceac;
                auVar91 = vfmadd213ps_fma(auVar91,auVar179,auVar282);
                auVar283._8_4_ = 0xbe7ffffc;
                auVar283._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar283._12_4_ = 0xbe7ffffc;
                auVar91 = vfmadd213ps_fma(auVar91,auVar179,auVar283);
                auVar284._8_4_ = 0x3eaaaaaa;
                auVar284._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar284._12_4_ = 0x3eaaaaaa;
                auVar91 = vfmadd213ps_fma(auVar91,auVar179,auVar284);
                auVar265._0_4_ = auVar249._0_4_ * auVar179._0_4_ * auVar91._0_4_;
                auVar265._4_4_ = auVar249._4_4_ * auVar179._4_4_ * auVar91._4_4_;
                auVar265._8_4_ = auVar249._8_4_ * auVar179._8_4_ * auVar91._8_4_;
                auVar265._12_4_ = auVar249._12_4_ * auVar179._12_4_ * auVar91._12_4_;
                auVar91 = vfmadd231ps_fma(auVar265,auVar126,auVar254);
                auVar90 = vfmsub231ps_fma(auVar91,auVar203,auVar249);
                auVar91 = vcmpps_avx(auVar162,_DAT_00552030,2);
                auVar90 = vsubps_avx(auVar90,auVar179);
                auVar126 = vfnmadd231ps_fma(auVar90,auVar68,auVar126);
                auVar180._0_4_ = auVar126._0_4_ + auVar126._0_4_;
                auVar180._4_4_ = auVar126._4_4_ + auVar126._4_4_;
                auVar180._8_4_ = auVar126._8_4_ + auVar126._8_4_;
                auVar180._12_4_ = auVar126._12_4_ + auVar126._12_4_;
                auVar220._8_4_ = 0x7fffffff;
                auVar220._0_8_ = 0x7fffffff7fffffff;
                auVar220._12_4_ = 0x7fffffff;
                auVar91 = vblendvps_avx(auVar180,auVar220,auVar91);
                auVar91 = vminps_avx(auVar309,auVar91);
                auVar90 = vmaxps_avx(auVar297,auVar91);
                auVar181._8_4_ = 0x3fb8aa3b;
                auVar181._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar181._12_4_ = 0x3fb8aa3b;
                auVar91 = vfmadd213ps_fma(auVar181,auVar90,auVar203);
                auVar221._0_4_ = (int)auVar91._0_4_;
                auVar221._4_4_ = (int)auVar91._4_4_;
                auVar221._8_4_ = (int)auVar91._8_4_;
                auVar221._12_4_ = (int)auVar91._12_4_;
                auVar126 = vcvtdq2ps_avx(auVar221);
                auVar91 = vcmpps_avx(auVar91,auVar126,1);
                auVar91 = vandps_avx(auVar91,auVar205);
                auVar91 = vsubps_avx(auVar126,auVar91);
                auVar126 = vfmsub231ps_fma(auVar90,auVar91,auVar68);
                auVar90 = vfnmsub231ps_fma(auVar126,auVar91,auVar254);
                auVar222._0_4_ = auVar90._0_4_ * auVar90._0_4_;
                auVar222._4_4_ = auVar90._4_4_ * auVar90._4_4_;
                auVar222._8_4_ = auVar90._8_4_ * auVar90._8_4_;
                auVar222._12_4_ = auVar90._12_4_ * auVar90._12_4_;
                auVar250._8_4_ = 0x39506967;
                auVar250._0_8_ = 0x3950696739506967;
                auVar250._12_4_ = 0x39506967;
                auVar204 = ZEXT864(0);
                auVar126 = vfmadd213ps_fma(auVar250,auVar90,auVar300);
                auVar69._8_4_ = 0x3c088908;
                auVar69._0_8_ = 0x3c0889083c088908;
                auVar69._12_4_ = 0x3c088908;
                auVar126 = vfmadd213ps_fma(auVar126,auVar90,auVar69);
                auVar126 = vfmadd213ps_fma(auVar126,auVar90,auVar196);
                auVar126 = vfmadd213ps_fma(auVar126,auVar90,auVar211);
                auVar126 = vfmadd213ps_fma(auVar126,auVar90,auVar203);
                auVar126 = vfmadd213ps_fma(auVar126,auVar222,auVar90);
                auVar132._0_4_ = auVar126._0_4_ + 1.0;
                auVar132._4_4_ = auVar126._4_4_ + 1.0;
                auVar132._8_4_ = auVar126._8_4_ + 1.0;
                auVar132._12_4_ = auVar126._12_4_ + 1.0;
                auVar182._0_4_ = (int)auVar91._0_4_;
                auVar182._4_4_ = (int)auVar91._4_4_;
                auVar182._8_4_ = (int)auVar91._8_4_;
                auVar182._12_4_ = (int)auVar91._12_4_;
                auVar91 = vpslld_avx(auVar182,0x17);
                auVar91 = vpaddd_avx(auVar91,auVar205);
                auVar126 = vfmadd213ps_fma(auVar91,auVar132,auVar205);
                auVar91 = vrcpps_avx(auVar126);
                auVar223._0_4_ = auVar91._0_4_ + auVar91._0_4_;
                auVar223._4_4_ = auVar91._4_4_ + auVar91._4_4_;
                auVar223._8_4_ = auVar91._8_4_ + auVar91._8_4_;
                auVar223._12_4_ = auVar91._12_4_ + auVar91._12_4_;
                auVar70._8_4_ = 0x40000000;
                auVar70._0_8_ = 0x4000000040000000;
                auVar70._12_4_ = 0x40000000;
                auVar126 = vfmsub213ps_fma(auVar126,auVar223,auVar70);
                auVar91 = vfnmadd213ps_fma(auVar126,auVar91,auVar223);
                auVar96 = vfmsub231ps_fma(auVar96,auVar96,auVar91);
                break;
              case 6:
                uVar2 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var7);
                auVar137._4_4_ = uVar2;
                auVar137._0_4_ = uVar2;
                auVar137._8_4_ = uVar2;
                auVar137._12_4_ = uVar2;
                uVar2 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var7))[1];
                auVar188._4_4_ = uVar2;
                auVar188._0_4_ = uVar2;
                auVar188._8_4_ = uVar2;
                auVar188._12_4_ = uVar2;
                auVar126 = vfmadd231ps_fma(auVar188,auVar96,auVar137);
                auVar91 = vmaxps_avx(auVar91,auVar126);
                auVar91 = vminps_avx(auVar91,auVar205);
                auVar96._0_4_ = auVar91._0_4_ * auVar96._0_4_;
                auVar96._4_4_ = auVar91._4_4_ * auVar96._4_4_;
                auVar96._8_4_ = auVar91._8_4_ * auVar96._8_4_;
                auVar96._12_4_ = auVar91._12_4_ * auVar96._12_4_;
              }
              if (iVar43 == 1) {
                *(int *)*local_188 = auVar96._0_4_;
                uVar2 = vextractps_avx(auVar96,1);
                *(undefined4 *)((long)*local_188 + (long)iVar57 * 4) = uVar2;
                uVar2 = vextractps_avx(auVar96,2);
                *(undefined4 *)((long)*local_188 + (long)(iVar57 * 2) * 4) = uVar2;
                uVar2 = vextractps_avx(auVar96,3);
                *(undefined4 *)((long)*local_188 + (long)(iVar57 * 3) * 4) = uVar2;
                local_188 = (undefined1 (*) [16])((long)*local_188 + 4);
              }
              else if (iVar43 == 4) {
                *local_188 = auVar96;
                local_188 = local_188 + 1;
              }
              lVar32 = lVar32 + 1;
              iVar42 = iVar42 + iVar47 * local_c8.elempack;
              local_150 = local_150 + lVar31 * 4;
              local_118._0_8_ = local_118._0_8_ + lVar31 * 4;
            } while (lVar32 != lVar58);
          }
          local_170 = local_170 + 1;
        } while (local_170 != (uint)(iVar53 >> 2));
      }
      uVar37 = uVar50 * 8 + (iVar53 >> 2) * 4;
      local_60 = (ulong)uVar37;
      uVar34 = (ulong)(uint)((int)(iVar29 - uVar37) / 2);
      local_68 = uVar34;
      if (1 < (int)(iVar29 - uVar37)) {
        uVar48 = local_c8.h * local_c8.elempack;
        uVar50 = top_blob->w;
        local_70 = (long)(int)uVar50 * top_blob->elemsize;
        sVar9 = (this->weight_data_tm).elemsize;
        sVar10 = (this->weight_data_tm).cstep;
        iVar29 = local_c8.elempack * iVar47;
        bVar63 = local_c8.elempack == 1;
        local_f8 = uVar48 & 0xfffffff8;
        iVar57 = local_c8.elempack * iVar47;
        lVar32 = (long)(iVar6 * 4) * 4;
        local_38 = top_blob->data;
        local_40 = (this->weight_data_tm).data;
        local_48 = (long)(int)uVar37;
        lVar58 = lVar30 * 4;
        local_50 = lVar60 * 4;
        local_180 = 0;
        do {
          pvVar11 = local_c8.data;
          if (0 < (int)uVar50) {
            lVar33 = local_48 + local_180 * 2;
            puVar54 = (undefined4 *)((local_48 + local_180 * 2 + 1) * local_70 + (long)local_38);
            puVar59 = (undefined4 *)(lVar33 * local_70 + (long)local_38);
            uVar37 = (uint)lVar33;
            uVar51 = uVar37 + 3;
            uVar27 = uVar37 + 7;
            if (-1 < (int)uVar37) {
              uVar51 = uVar37;
              uVar27 = uVar37;
            }
            cVar24 = (char)lVar33 - ((byte)uVar27 & 0xf8);
            pauVar61 = (undefined1 (*) [32])
                       ((long)(((int)(uVar37 - (uVar51 & 0xfffffffc)) >> 1) + ((int)uVar27 >> 3) +
                              (int)((char)(((byte)(cVar24 >> 7) >> 6) + cVar24) >> 2)) *
                        sVar9 * sVar10 + (long)local_40);
            lVar38 = (long)local_c8.w * local_c8.elemsize;
            pfVar56 = *(float **)(&this->field_0xf8 + (long)p_Var7);
            local_158 = (long)(_func_int ***)local_c8.data + local_50;
            iVar53 = 0;
            local_200 = (Allocator *)local_c8.data;
            local_1f8 = 0;
            do {
              if (lVar8 == 0) {
                fVar66 = 0.0;
                fVar65 = 0.0;
              }
              else {
                pfVar1 = (float *)(lVar8 + lVar33 * 4);
                fVar66 = *pfVar1;
                fVar65 = pfVar1[1];
              }
              pauVar55 = pauVar61;
              if ((int)uVar48 < 8) {
                auVar79 = SUB6432(ZEXT864(0),0);
                auVar310 = SUB6432(ZEXT864(0),0);
                uVar37 = 0;
              }
              else {
                auVar204 = ZEXT864(0);
                auVar210 = ZEXT864(0);
                iVar43 = 0;
                do {
                  lVar49 = (iVar43 / iVar4) * lVar38;
                  if (iVar4 == 8) {
                    if (0 < iVar5) {
                      pauVar36 = (undefined1 (*) [32])
                                 ((long)(_func_int ***)pvVar11 + lVar49 + (long)iVar53 * 4);
                      iVar42 = iVar5;
                      do {
                        auVar91 = vfmadd231ps_fma(auVar210._0_32_,*pauVar36,*pauVar55);
                        auVar210 = ZEXT1664(auVar91);
                        auVar91 = vfmadd231ps_fma(auVar204._0_32_,*pauVar36,pauVar55[1]);
                        auVar204 = ZEXT1664(auVar91);
                        pauVar55 = pauVar55 + 2;
                        pauVar36 = (undefined1 (*) [32])(*pauVar36 + (long)(iVar6 * 8) * 4);
                        iVar42 = iVar42 + -1;
                      } while (iVar42 != 0);
                      goto LAB_004fe8c6;
                    }
                  }
                  else {
                    pauVar36 = (undefined1 (*) [32])
                               ((long)(_func_int ***)pvVar11 +
                               lVar49 + (long)(iVar29 * (int)local_1f8) * 4);
LAB_004fe8c6:
                    if (iVar4 == 4) {
                      iVar42 = iVar5;
                      if (iVar5 < 1) goto LAB_004fe989;
                      do {
                        auVar193._16_16_ = *(undefined1 (*) [16])(*pauVar36 + lVar60 * 4);
                        auVar193._0_16_ = *(undefined1 (*) [16])*pauVar36;
                        auVar91 = vfmadd231ps_fma(auVar210._0_32_,auVar193,*pauVar55);
                        auVar210 = ZEXT1664(auVar91);
                        auVar91 = vfmadd231ps_fma(auVar204._0_32_,auVar193,pauVar55[1]);
                        auVar204 = ZEXT1664(auVar91);
                        pauVar55 = pauVar55 + 2;
                        pauVar36 = (undefined1 (*) [32])(*pauVar36 + lVar32);
                        iVar42 = iVar42 + -1;
                      } while (iVar42 != 0);
                    }
                    iVar42 = iVar5;
                    if (0 < iVar5 && bVar63) {
                      do {
                        auVar91 = vinsertps_avx(ZEXT416(*(uint *)*pauVar36),
                                                ZEXT416(*(uint *)(*pauVar36 + lVar60 * 4)),0x10);
                        auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(*pauVar36 +
                                                                         (long)(iVar26 * 2) * 4)),
                                                0x20);
                        auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(*pauVar36 +
                                                                         (long)(iVar26 * 3) * 4)),
                                                0x30);
                        auVar126 = vinsertps_avx(ZEXT416(*(uint *)(*pauVar36 +
                                                                  (long)(iVar26 * 4) * 4)),
                                                 ZEXT416(*(uint *)(*pauVar36 +
                                                                  (long)(iVar26 * 5) * 4)),0x10);
                        auVar126 = vinsertps_avx(auVar126,ZEXT416(*(uint *)(*pauVar36 +
                                                                           (long)(iVar26 * 6) * 4)),
                                                 0x20);
                        auVar126 = vinsertps_avx(auVar126,ZEXT416(*(uint *)(*pauVar36 +
                                                                           (long)(iVar26 * 7) * 4)),
                                                 0x30);
                        auVar194._16_16_ = auVar126;
                        auVar194._0_16_ = auVar91;
                        auVar91 = vfmadd231ps_fma(auVar210._0_32_,auVar194,*pauVar55);
                        auVar210 = ZEXT1664(auVar91);
                        auVar91 = vfmadd231ps_fma(auVar204._0_32_,auVar194,pauVar55[1]);
                        auVar204 = ZEXT1664(auVar91);
                        pauVar55 = pauVar55 + 2;
                        pauVar36 = (undefined1 (*) [32])(*pauVar36 + lVar58);
                        iVar42 = iVar42 + -1;
                      } while (iVar42 != 0);
                    }
                  }
LAB_004fe989:
                  auVar310 = auVar204._0_32_;
                  auVar79 = auVar210._0_32_;
                  iVar42 = iVar43 + 0xf;
                  iVar43 = iVar43 + 8;
                  uVar37 = local_f8;
                } while (iVar42 < (int)uVar48);
              }
              auVar91 = ZEXT816(0) << 0x40;
              auVar204 = ZEXT1664(auVar91);
              if ((int)(uVar37 | 3) < (int)uVar48) {
                auVar210 = ZEXT864(0);
                uVar27 = uVar37;
                do {
                  lVar49 = ((int)uVar27 / iVar4) * lVar38;
                  if (iVar4 == 4) {
                    if (0 < iVar5) {
                      pauVar62 = (undefined1 (*) [16])
                                 ((long)(_func_int ***)pvVar11 + lVar49 + (long)iVar53 * 4);
                      iVar43 = iVar5;
                      do {
                        auVar91 = vfmadd231ps_fma(auVar204._0_16_,*pauVar62,
                                                  *(undefined1 (*) [16])*pauVar55);
                        auVar204 = ZEXT1664(auVar91);
                        auVar91 = vfmadd231ps_fma(auVar210._0_16_,*pauVar62,
                                                  *(undefined1 (*) [16])(*pauVar55 + 0x10));
                        auVar210 = ZEXT1664(auVar91);
                        pauVar55 = pauVar55 + 1;
                        pauVar62 = (undefined1 (*) [16])(*pauVar62 + lVar32);
                        iVar43 = iVar43 + -1;
                      } while (iVar43 != 0);
                      goto LAB_004fea3a;
                    }
                  }
                  else {
                    pauVar62 = (undefined1 (*) [16])
                               ((long)(_func_int ***)pvVar11 +
                               lVar49 + (long)(iVar29 * (int)local_1f8) * 4);
LAB_004fea3a:
                    iVar43 = iVar5;
                    if (0 < iVar5 && bVar63) {
                      do {
                        auVar91 = vinsertps_avx(ZEXT416(*(uint *)*pauVar62),
                                                ZEXT416(*(uint *)(*pauVar62 + lVar60 * 4)),0x10);
                        auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(*pauVar62 +
                                                                         (long)(iVar26 * 2) * 4)),
                                                0x20);
                        auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(*pauVar62 +
                                                                         (long)(iVar26 * 3) * 4)),
                                                0x30);
                        auVar126 = vfmadd231ps_fma(auVar204._0_16_,auVar91,
                                                   *(undefined1 (*) [16])*pauVar55);
                        auVar204 = ZEXT1664(auVar126);
                        auVar91 = vfmadd231ps_fma(auVar210._0_16_,auVar91,
                                                  *(undefined1 (*) [16])(*pauVar55 + 0x10));
                        auVar210 = ZEXT1664(auVar91);
                        pauVar55 = pauVar55 + 1;
                        pauVar62 = (undefined1 (*) [16])(*pauVar62 + lVar58);
                        iVar43 = iVar43 + -1;
                      } while (iVar43 != 0);
                    }
                  }
                  auVar126 = auVar210._0_16_;
                  auVar91 = auVar204._0_16_;
                  uVar37 = uVar27 + 4;
                  iVar43 = uVar27 + 7;
                  uVar27 = uVar37;
                } while (iVar43 < (int)uVar48);
              }
              else {
                auVar126 = SUB6416(ZEXT864(0),0);
              }
              uVar35 = (ulong)uVar37;
              auVar138._0_4_ = auVar79._16_4_ + auVar79._0_4_;
              auVar138._4_4_ = auVar79._20_4_ + auVar79._4_4_;
              auVar138._8_4_ = auVar79._24_4_ + auVar79._8_4_;
              auVar138._12_4_ = auVar79._28_4_ + auVar79._12_4_;
              auVar90 = vshufpd_avx(auVar138,auVar138,1);
              auVar139._0_4_ = auVar90._0_4_ + auVar138._0_4_;
              auVar139._4_4_ = auVar90._4_4_ + auVar138._4_4_;
              auVar139._8_4_ = auVar90._8_4_ + auVar138._8_4_;
              auVar139._12_4_ = auVar90._12_4_ + auVar138._12_4_;
              auVar100._0_4_ = auVar310._16_4_ + auVar310._0_4_;
              auVar100._4_4_ = auVar310._20_4_ + auVar310._4_4_;
              auVar100._8_4_ = auVar310._24_4_ + auVar310._8_4_;
              auVar100._12_4_ = auVar310._28_4_ + auVar310._12_4_;
              auVar90 = vshufpd_avx(auVar100,auVar100,1);
              auVar101._0_4_ = auVar90._0_4_ + auVar100._0_4_;
              auVar101._4_4_ = auVar90._4_4_ + auVar100._4_4_;
              auVar101._8_4_ = auVar90._8_4_ + auVar100._8_4_;
              auVar101._12_4_ = auVar90._12_4_ + auVar100._12_4_;
              auVar90 = vshufpd_avx(auVar91,auVar91,1);
              auVar198._0_4_ = auVar90._0_4_ + auVar91._0_4_;
              auVar198._4_4_ = auVar90._4_4_ + auVar91._4_4_;
              auVar198._8_4_ = auVar90._8_4_ + auVar91._8_4_;
              auVar198._12_4_ = auVar90._12_4_ + auVar91._12_4_;
              auVar91 = vinsertps_avx(auVar101,auVar139,0x4c);
              auVar90 = vshufpd_avx(auVar126,auVar126,1);
              auVar189._0_4_ = auVar90._0_4_ + auVar126._0_4_;
              auVar189._4_4_ = auVar90._4_4_ + auVar126._4_4_;
              auVar189._8_4_ = auVar90._8_4_ + auVar126._8_4_;
              auVar189._12_4_ = auVar90._12_4_ + auVar126._12_4_;
              auVar126 = vinsertps_avx(auVar139,auVar101,0x1c);
              auVar90 = vinsertps_avx(auVar189,auVar198,0x4c);
              auVar92 = vinsertps_avx(auVar198,auVar189,0x1c);
              auVar204 = ZEXT1664(CONCAT412(auVar91._12_4_ + 0.0 + auVar126._12_4_ + auVar90._12_4_
                                            + auVar92._12_4_,
                                            CONCAT48(auVar91._8_4_ + 0.0 +
                                                     auVar126._8_4_ + auVar90._8_4_ + auVar92._8_4_,
                                                     CONCAT44(auVar91._4_4_ + fVar65 +
                                                              auVar126._4_4_ + auVar90._4_4_ +
                                                              auVar92._4_4_,
                                                              auVar91._0_4_ + fVar66 +
                                                              auVar126._0_4_ + auVar90._0_4_ +
                                                              auVar92._0_4_))));
              if ((int)(uVar37 | 1) < (int)uVar48) {
                lVar49 = local_158 + lVar38 * uVar35;
                ppp_Var40 = (_func_int ***)((long)&local_200->_vptr_Allocator + lVar38 * uVar35);
                do {
                  if (0 < iVar5) {
                    lVar39 = 0;
                    iVar43 = iVar5;
                    do {
                      uVar2 = *(undefined4 *)((long)ppp_Var40 + lVar39);
                      auVar74._4_4_ = uVar2;
                      auVar74._0_4_ = uVar2;
                      auVar74._8_4_ = uVar2;
                      auVar74._12_4_ = uVar2;
                      auVar102._8_8_ = 0;
                      auVar102._0_8_ = *(ulong *)*pauVar55;
                      auVar91 = vfmadd213ps_fma(auVar102,auVar74,auVar204._0_16_);
                      auVar75._8_8_ = 0;
                      auVar75._0_8_ = *(ulong *)(*pauVar55 + 8);
                      uVar2 = *(undefined4 *)(lVar49 + lVar39);
                      auVar206._4_4_ = uVar2;
                      auVar206._0_4_ = uVar2;
                      auVar206._8_4_ = uVar2;
                      auVar206._12_4_ = uVar2;
                      auVar91 = vfmadd213ps_fma(auVar206,auVar75,auVar91);
                      auVar204 = ZEXT1664(auVar91);
                      pauVar55 = (undefined1 (*) [32])(*pauVar55 + 0x10);
                      lVar39 = lVar39 + lVar58;
                      iVar43 = iVar43 + -1;
                    } while (iVar43 != 0);
                  }
                  uVar35 = uVar35 + 2;
                  uVar37 = (uint)uVar35;
                  lVar49 = lVar49 + lVar38 * 2;
                  ppp_Var40 = (_func_int ***)((long)ppp_Var40 + lVar38 * 2);
                } while ((int)(uVar37 | 1) < (int)uVar48);
              }
              auVar91 = auVar204._0_16_;
              if ((int)uVar37 < (int)uVar48) {
                uVar35 = (ulong)uVar37;
                ppp_Var40 = (_func_int ***)((long)&local_200->_vptr_Allocator + lVar38 * uVar35);
                do {
                  ppp_Var46 = ppp_Var40;
                  iVar43 = iVar5;
                  if (0 < iVar5) {
                    do {
                      auVar76._8_8_ = 0;
                      auVar76._0_8_ = *(ulong *)*pauVar55;
                      uVar2 = *(undefined4 *)ppp_Var46;
                      auVar103._4_4_ = uVar2;
                      auVar103._0_4_ = uVar2;
                      auVar103._8_4_ = uVar2;
                      auVar103._12_4_ = uVar2;
                      auVar91 = vfmadd231ps_fma(auVar204._0_16_,auVar76,auVar103);
                      auVar204 = ZEXT1664(auVar91);
                      pauVar55 = (undefined1 (*) [32])(*pauVar55 + 8);
                      ppp_Var46 = (_func_int ***)((long)ppp_Var46 + lVar58);
                      iVar43 = iVar43 + -1;
                    } while (iVar43 != 0);
                  }
                  auVar91 = auVar204._0_16_;
                  uVar35 = uVar35 + 1;
                  ppp_Var40 = (_func_int ***)((long)ppp_Var40 + lVar38);
                } while ((int)uVar35 < (int)uVar48);
              }
              fVar66 = auVar91._0_4_;
              auVar208 = auVar91;
              switch((int)local_78) {
              case 1:
                auVar208 = vmaxps_avx(auVar91,_DAT_00552030);
                break;
              case 2:
                auVar126 = vcmpps_avx(ZEXT816(0) << 0x40,auVar91,1);
                fVar65 = *pfVar56;
                auVar106._4_4_ = fVar65;
                auVar106._0_4_ = fVar65;
                auVar106._8_4_ = fVar65;
                auVar106._12_4_ = fVar65;
                auVar141._8_4_ = 0x3f800000;
                auVar141._0_8_ = 0x3f8000003f800000;
                auVar141._12_4_ = 0x3f800000;
                auVar126 = vblendvps_avx(auVar106,auVar141,auVar126);
                goto LAB_004fed5d;
              case 3:
                auVar77._8_8_ = 0;
                auVar77._0_8_ = *(ulong *)pfVar56;
                auVar126 = vmaxss_avx(auVar77,auVar91);
                auVar90 = vinsertps_avx(auVar77,auVar126,0x10);
                auVar126 = vinsertps_avx(auVar77,auVar91,0x4c);
                auVar126 = vcmpps_avx(auVar126,auVar90,1);
                auVar91 = vinsertps_avx(auVar90,auVar91,0x4c);
                auVar91 = vblendvps_avx(auVar91,auVar77,auVar126);
                auVar208 = vshufps_avx(auVar91,auVar91,0xe1);
                auVar91 = vcmpps_avx(auVar77,auVar208,1);
                if ((auVar91 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  auVar208 = vinsertps_avx(auVar208,auVar77,0x50);
                }
                break;
              case 4:
                auVar140._8_4_ = 0x42b0c0a5;
                auVar140._0_8_ = 0x42b0c0a542b0c0a5;
                auVar140._12_4_ = 0x42b0c0a5;
                auVar126 = vminps_avx(auVar91,auVar140);
                auVar104._8_4_ = 0xc2b0c0a5;
                auVar104._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar104._12_4_ = 0xc2b0c0a5;
                auVar91 = vcmpps_avx(auVar126,auVar104,1);
                auVar78._0_8_ = auVar126._0_8_ ^ 0x8000000080000000;
                auVar78._8_4_ = auVar126._8_4_ ^ 0x80000000;
                auVar78._12_4_ = auVar126._12_4_ ^ 0x80000000;
                auVar91 = vblendvps_avx(auVar78,auVar140,auVar91);
                local_1a8._0_4_ = expf(auVar91._0_4_);
                local_1a8._4_4_ = extraout_XMM0_Db_00;
                local_1a8._8_4_ = extraout_XMM0_Dc_00;
                local_1a8._12_4_ = extraout_XMM0_Dd_00;
                auVar91 = vmovshdup_avx(auVar91);
                auVar210._0_4_ = expf(auVar91._0_4_);
                auVar210._4_60_ = extraout_var_00;
                auVar91 = vinsertps_avx(local_1a8,auVar210._0_16_,0x10);
                auVar105._8_4_ = 0x3f800000;
                auVar105._0_8_ = 0x3f8000003f800000;
                auVar105._12_4_ = 0x3f800000;
                auVar207._0_4_ = auVar91._0_4_ + 1.0;
                auVar207._4_4_ = auVar91._4_4_ + 1.0;
                auVar207._8_4_ = auVar91._8_4_ + 1.0;
                auVar207._12_4_ = auVar91._12_4_ + 1.0;
                auVar91 = vrcpps_avx(auVar207);
                auVar126 = vfmsub213ps_fma(auVar207,auVar91,auVar105);
                auVar208 = vfnmadd132ps_fma(auVar126,auVar91,auVar91);
                break;
              case 5:
                fVar65 = expf(fVar66);
                fVar65 = logf(fVar65 + 1.0);
                local_118._0_4_ = tanhf(fVar65);
                local_118._4_4_ = extraout_XMM0_Db;
                local_118._8_4_ = extraout_XMM0_Dc;
                local_118._12_4_ = extraout_XMM0_Dd;
                auVar126 = vmovshdup_avx(auVar91);
                fVar65 = expf(auVar126._0_4_);
                fVar65 = logf(fVar65 + 1.0);
                auVar204._0_4_ = tanhf(fVar65);
                auVar204._4_60_ = extraout_var;
                auVar126 = vinsertps_avx(local_118,auVar204._0_16_,0x10);
LAB_004fed5d:
                auVar208._0_4_ = auVar126._0_4_ * fVar66;
                auVar208._4_4_ = auVar126._4_4_ * auVar91._4_4_;
                auVar208._8_4_ = auVar126._8_4_ * auVar91._8_4_;
                auVar208._12_4_ = auVar126._12_4_ * auVar91._12_4_;
                break;
              case 6:
                fVar65 = *pfVar56;
                fVar3 = pfVar56[1];
                fVar125 = -fVar3 / fVar65;
                auVar126 = SUB6416(ZEXT464(0),0) << 0x20;
                if ((fVar125 <= fVar66) && (auVar126 = auVar91, fVar66 <= fVar125 + 1.0 / fVar65)) {
                  auVar126 = vfmadd213ss_fma(auVar91,ZEXT416((uint)fVar65),ZEXT416((uint)fVar3));
                  auVar126 = ZEXT416((uint)(auVar126._0_4_ * fVar66));
                }
                auVar90 = vmovshdup_avx(auVar91);
                fVar66 = auVar90._0_4_;
                if (fVar125 <= fVar66) {
                  auVar208._4_12_ = auVar91._4_12_;
                  auVar208._0_4_ = (float)auVar126._0_4_;
                  if (fVar66 <= fVar125 + 1.0 / fVar65) {
                    auVar91 = vfmadd213ss_fma(ZEXT416((uint)fVar65),auVar90,ZEXT416((uint)fVar3));
                    auVar208 = vinsertps_avx(auVar208,ZEXT416((uint)(auVar91._0_4_ * fVar66)),0x10);
                  }
                }
                else {
                  auVar208 = vblendps_avx(auVar126,_DAT_00552030,0xe);
                }
              }
              *puVar59 = auVar208._0_4_;
              uVar2 = vextractps_avx(auVar208,1);
              *puVar54 = uVar2;
              puVar59 = puVar59 + 1;
              puVar54 = puVar54 + 1;
              local_1f8 = local_1f8 + 1;
              iVar53 = iVar53 + iVar57;
              local_158 = local_158 + lVar31 * 4;
              local_200 = (Allocator *)((long)&local_200->_vptr_Allocator + lVar31 * 4);
            } while (local_1f8 != uVar50);
          }
          local_180 = local_180 + 1;
        } while (local_180 != uVar34);
      }
      iVar29 = (int)local_60 + (int)local_68 * 2;
      if (iVar29 < (int)local_80) {
        pvVar11 = top_blob->data;
        iVar57 = top_blob->w;
        sVar9 = top_blob->elemsize;
        sVar10 = (this->weight_data_tm).elemsize;
        sVar12 = (this->weight_data_tm).cstep;
        bVar63 = 0 < iVar5;
        local_198 = uVar25 & 0xfffffff8;
        local_1c8 = (ulong)iVar29;
        lVar58 = (long)(iVar6 * 4) * 4;
        lVar30 = lVar30 * 4;
        pvVar13 = (this->weight_data_tm).data;
        do {
          pvVar23 = local_c8.data;
          if (0 < (int)local_58) {
            pfVar56 = (float *)((long)iVar57 * sVar9 * local_1c8 + (long)pvVar11);
            iVar29 = (int)local_1c8;
            iVar53 = iVar29 + 7;
            if (-1 < iVar29) {
              iVar53 = iVar29;
            }
            iVar43 = iVar29 + 3;
            if (-1 < iVar29) {
              iVar43 = iVar29;
            }
            cVar24 = (char)local_1c8 - ((byte)iVar53 & 0xf8);
            pauVar61 = (undefined1 (*) [32])
                       ((long)(int)((iVar29 - (((uint)(local_1c8 >> 0x1f) & 1) + iVar29 & 0xfffffffe
                                              )) + (iVar53 >> 3) +
                                    (int)((char)((char)local_1c8 - ((byte)iVar43 & 0xfc)) / '\x02')
                                   + (int)((char)(((byte)(cVar24 >> 7) >> 6) + cVar24) >> 2)) *
                        sVar10 * sVar12 + (long)pvVar13);
            lVar32 = (long)local_c8.w * local_c8.elemsize;
            pfVar1 = *(float **)(&this->field_0xf8 + (long)p_Var7);
            local_1e0 = (void *)((long)(_func_int ***)local_c8.data + lVar60 * 4);
            iVar29 = 0;
            local_200 = (Allocator *)local_c8.data;
            local_1f8 = 0;
            do {
              if (lVar8 == 0) {
                fVar66 = 0.0;
              }
              else {
                fVar66 = *(float *)(lVar8 + local_1c8 * 4);
              }
              pauVar55 = pauVar61;
              if ((int)uVar25 < 8) {
                auVar310 = SUB6432(ZEXT864(0),0);
                uVar37 = 0;
              }
              else {
                auVar204 = ZEXT864(0);
                iVar53 = 0;
                do {
                  lVar33 = (iVar53 / iVar4) * lVar32;
                  if (iVar4 == 8 && bVar63) {
                    pauVar36 = (undefined1 (*) [32])
                               ((long)(_func_int ***)pvVar23 + lVar33 + (long)iVar29 * 4);
                    iVar43 = iVar5;
                    do {
                      auVar91 = vfmadd231ps_fma(auVar204._0_32_,*pauVar36,*pauVar55);
                      auVar204 = ZEXT1664(auVar91);
                      pauVar55 = pauVar55 + 1;
                      pauVar36 = (undefined1 (*) [32])(*pauVar36 + (long)(iVar6 * 8) * 4);
                      iVar43 = iVar43 + -1;
                    } while (iVar43 != 0);
                  }
                  else {
                    pauVar36 = (undefined1 (*) [32])
                               ((long)(_func_int ***)pvVar23 +
                               lVar33 + (long)(iVar4 * iVar47 * (int)local_1f8) * 4);
                  }
                  if (iVar4 == 4) {
                    iVar43 = iVar5;
                    if (0 < iVar5) {
                      do {
                        auVar159._16_16_ = *(undefined1 (*) [16])(*pauVar36 + lVar60 * 4);
                        auVar159._0_16_ = *(undefined1 (*) [16])*pauVar36;
                        auVar91 = vfmadd231ps_fma(auVar204._0_32_,auVar159,*pauVar55);
                        auVar204 = ZEXT1664(auVar91);
                        pauVar55 = pauVar55 + 1;
                        pauVar36 = (undefined1 (*) [32])(*pauVar36 + lVar58);
                        iVar43 = iVar43 + -1;
                      } while (iVar43 != 0);
                      goto LAB_004ff1fa;
                    }
                  }
                  else {
LAB_004ff1fa:
                    iVar43 = iVar5;
                    if (iVar4 == 1 && bVar63) {
                      do {
                        auVar91 = vinsertps_avx(ZEXT416(*(uint *)*pauVar36),
                                                ZEXT416(*(uint *)(*pauVar36 + lVar60 * 4)),0x10);
                        auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(*pauVar36 +
                                                                         (long)(iVar26 * 2) * 4)),
                                                0x20);
                        auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(*pauVar36 +
                                                                         (long)(iVar26 * 3) * 4)),
                                                0x30);
                        auVar126 = vinsertps_avx(ZEXT416(*(uint *)(*pauVar36 +
                                                                  (long)(iVar26 * 4) * 4)),
                                                 ZEXT416(*(uint *)(*pauVar36 +
                                                                  (long)(iVar26 * 5) * 4)),0x10);
                        auVar126 = vinsertps_avx(auVar126,ZEXT416(*(uint *)(*pauVar36 +
                                                                           (long)(iVar26 * 6) * 4)),
                                                 0x20);
                        auVar126 = vinsertps_avx(auVar126,ZEXT416(*(uint *)(*pauVar36 +
                                                                           (long)(iVar26 * 7) * 4)),
                                                 0x30);
                        auVar160._16_16_ = auVar126;
                        auVar160._0_16_ = auVar91;
                        auVar91 = vfmadd231ps_fma(auVar204._0_32_,auVar160,*pauVar55);
                        auVar204 = ZEXT1664(auVar91);
                        pauVar55 = pauVar55 + 1;
                        pauVar36 = (undefined1 (*) [32])(*pauVar36 + lVar30);
                        iVar43 = iVar43 + -1;
                      } while (iVar43 != 0);
                    }
                  }
                  auVar310 = auVar204._0_32_;
                  iVar43 = iVar53 + 0xf;
                  iVar53 = iVar53 + 8;
                  uVar37 = local_198;
                } while (iVar43 < (int)uVar25);
              }
              auVar91 = ZEXT816(0) << 0x40;
              auVar204 = ZEXT1664(auVar91);
              if ((int)(uVar37 | 3) < (int)uVar25) {
                uVar50 = uVar37;
                do {
                  lVar33 = ((int)uVar50 / iVar4) * lVar32;
                  if (iVar4 == 4 && bVar63) {
                    pauVar62 = (undefined1 (*) [16])
                               ((long)(_func_int ***)pvVar23 + lVar33 + (long)iVar29 * 4);
                    iVar53 = iVar5;
                    do {
                      auVar91 = vfmadd231ps_fma(auVar204._0_16_,*pauVar62,
                                                *(undefined1 (*) [16])*pauVar55);
                      auVar204 = ZEXT1664(auVar91);
                      pauVar55 = (undefined1 (*) [32])(*pauVar55 + 0x10);
                      pauVar62 = (undefined1 (*) [16])(*pauVar62 + lVar58);
                      iVar53 = iVar53 + -1;
                    } while (iVar53 != 0);
                  }
                  else {
                    pauVar62 = (undefined1 (*) [16])
                               ((long)(_func_int ***)pvVar23 +
                               lVar33 + (long)(iVar4 * iVar47 * (int)local_1f8) * 4);
                  }
                  iVar53 = iVar5;
                  if (iVar4 == 1 && bVar63) {
                    do {
                      auVar91 = vinsertps_avx(ZEXT416(*(uint *)*pauVar62),
                                              ZEXT416(*(uint *)(*pauVar62 + lVar60 * 4)),0x10);
                      auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(*pauVar62 +
                                                                       (long)(iVar26 * 2) * 4)),0x20
                                             );
                      auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(*pauVar62 +
                                                                       (long)(iVar26 * 3) * 4)),0x30
                                             );
                      auVar91 = vfmadd231ps_fma(auVar204._0_16_,auVar91,
                                                *(undefined1 (*) [16])*pauVar55);
                      auVar204 = ZEXT1664(auVar91);
                      pauVar55 = (undefined1 (*) [32])(*pauVar55 + 0x10);
                      pauVar62 = (undefined1 (*) [16])(*pauVar62 + lVar30);
                      iVar53 = iVar53 + -1;
                    } while (iVar53 != 0);
                  }
                  auVar91 = auVar204._0_16_;
                  uVar37 = uVar50 + 4;
                  iVar53 = uVar50 + 7;
                  uVar50 = uVar37;
                } while (iVar53 < (int)uVar25);
              }
              uVar34 = (ulong)uVar37;
              auVar107._0_4_ = auVar310._16_4_ + auVar310._0_4_;
              auVar107._4_4_ = auVar310._20_4_ + auVar310._4_4_;
              auVar107._8_4_ = auVar310._24_4_ + auVar310._8_4_;
              auVar107._12_4_ = auVar310._28_4_ + auVar310._12_4_;
              auVar126 = vshufpd_avx(auVar107,auVar107,1);
              auVar108._0_4_ = auVar126._0_4_ + auVar107._0_4_;
              auVar108._4_4_ = auVar126._4_4_ + auVar107._4_4_;
              auVar108._8_4_ = auVar126._8_4_ + auVar107._8_4_;
              auVar108._12_4_ = auVar126._12_4_ + auVar107._12_4_;
              auVar126 = vmovshdup_avx(auVar108);
              auVar90 = vshufpd_avx(auVar91,auVar91,1);
              auVar142._0_4_ = auVar90._0_4_ + auVar91._0_4_;
              auVar142._4_4_ = auVar90._4_4_ + auVar91._4_4_;
              auVar142._8_4_ = auVar90._8_4_ + auVar91._8_4_;
              auVar142._12_4_ = auVar90._12_4_ + auVar91._12_4_;
              auVar91 = vmovshdup_avx(auVar142);
              fVar66 = auVar126._0_4_ + fVar66 + auVar108._0_4_ + auVar142._0_4_ + auVar91._0_4_;
              auVar204 = ZEXT464((uint)fVar66);
              if ((int)(uVar37 | 1) < (int)uVar25) {
                pvVar45 = (void *)((long)local_1e0 + lVar32 * uVar34);
                ppp_Var40 = (_func_int ***)((long)&local_200->_vptr_Allocator + lVar32 * uVar34);
                do {
                  if (iVar5 < 1) {
                    auVar91 = auVar204._0_16_;
                  }
                  else {
                    lVar33 = 0;
                    iVar53 = iVar5;
                    do {
                      auVar91 = vfmadd132ss_fma(ZEXT416(*(uint *)*pauVar55),auVar204._0_16_,
                                                ZEXT416(*(uint *)((long)ppp_Var40 + lVar33)));
                      auVar91 = vfmadd231ss_fma(auVar91,ZEXT416(*(uint *)(*pauVar55 + 4)),
                                                ZEXT416(*(uint *)((long)pvVar45 + lVar33)));
                      pauVar55 = (undefined1 (*) [32])(*pauVar55 + 8);
                      lVar33 = lVar33 + lVar30;
                      auVar204 = ZEXT1664(auVar91);
                      iVar53 = iVar53 + -1;
                    } while (iVar53 != 0);
                  }
                  auVar210 = ZEXT1664(auVar91);
                  uVar34 = uVar34 + 2;
                  uVar37 = (uint)uVar34;
                  pvVar45 = (void *)((long)pvVar45 + lVar32 * 2);
                  ppp_Var40 = (_func_int ***)((long)ppp_Var40 + lVar32 * 2);
                  auVar204 = ZEXT1664(auVar91);
                } while ((int)(uVar37 | 1) < (int)uVar25);
              }
              else {
                auVar210 = ZEXT464((uint)fVar66);
              }
              auVar91 = auVar210._0_16_;
              if ((int)uVar37 < (int)uVar25) {
                uVar34 = (ulong)uVar37;
                ppp_Var40 = (_func_int ***)((long)&local_200->_vptr_Allocator + lVar32 * uVar34);
                do {
                  ppp_Var46 = ppp_Var40;
                  iVar53 = iVar5;
                  if (0 < iVar5) {
                    do {
                      auVar91 = vfmadd231ss_fma(auVar210._0_16_,ZEXT416(*(uint *)*pauVar55),
                                                ZEXT416(*(uint *)ppp_Var46));
                      auVar210 = ZEXT1664(auVar91);
                      pauVar55 = (undefined1 (*) [32])(*pauVar55 + 4);
                      ppp_Var46 = (_func_int ***)((long)ppp_Var46 + lVar30);
                      iVar53 = iVar53 + -1;
                    } while (iVar53 != 0);
                  }
                  auVar91 = auVar210._0_16_;
                  uVar34 = uVar34 + 1;
                  ppp_Var40 = (_func_int ***)((long)ppp_Var40 + lVar32);
                } while ((int)uVar34 < (int)uVar25);
              }
              fVar65 = auVar91._0_4_;
              fVar66 = fVar65;
              switch((int)local_78) {
              case 1:
                auVar91 = vmaxss_avx(auVar91,ZEXT416(0));
                fVar66 = auVar91._0_4_;
                break;
              case 2:
                auVar91 = vcmpss_avx(ZEXT816(0) << 0x40,auVar91,1);
                auVar144._8_4_ = 0x3f800000;
                auVar144._0_8_ = 0x3f8000003f800000;
                auVar144._12_4_ = 0x3f800000;
                auVar91 = vblendvps_avx(ZEXT416((uint)*pfVar1),auVar144,auVar91);
                fVar66 = auVar91._0_4_ * fVar65;
                break;
              case 3:
                auVar91 = vmaxss_avx(auVar91,ZEXT416((uint)*pfVar1));
                fVar66 = auVar91._0_4_;
                if (pfVar1[1] < auVar91._0_4_) {
                  fVar66 = pfVar1[1];
                }
                break;
              case 4:
                auVar91 = vminss_avx(auVar91,ZEXT416(0x42b0c0a5));
                auVar109._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
                auVar109._8_4_ = auVar91._8_4_ ^ 0x80000000;
                auVar109._12_4_ = auVar91._12_4_ ^ 0x80000000;
                auVar91 = vcmpss_avx(auVar91,ZEXT416(0xc2b0c0a5),1);
                auVar143._8_4_ = 0x42b0c0a5;
                auVar143._0_8_ = 0x42b0c0a542b0c0a5;
                auVar143._12_4_ = 0x42b0c0a5;
                auVar91 = vblendvps_avx(auVar109,auVar143,auVar91);
                fVar66 = expf(auVar91._0_4_);
                fVar66 = 1.0 / (fVar66 + 1.0);
                break;
              case 5:
                fVar66 = expf(fVar65);
                fVar66 = logf(fVar66 + 1.0);
                fVar66 = tanhf(fVar66);
                fVar66 = fVar66 * fVar65;
                break;
              case 6:
                fVar3 = *pfVar1;
                fVar125 = -pfVar1[1] / fVar3;
                fVar66 = 0.0;
                if ((fVar125 <= fVar65) && (fVar66 = fVar65, fVar65 <= fVar125 + 1.0 / fVar3)) {
                  auVar91 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar91,ZEXT416((uint)pfVar1[1]));
                  fVar66 = auVar91._0_4_ * fVar65;
                }
              }
              *pfVar56 = fVar66;
              pfVar56 = pfVar56 + 1;
              local_1f8 = local_1f8 + 1;
              iVar29 = iVar29 + iVar47 * iVar4;
              local_1e0 = (void *)((long)local_1e0 + lVar31 * 4);
              local_200 = (Allocator *)((long)&local_200->_vptr_Allocator + lVar31 * 4);
            } while (local_1f8 != local_58);
          }
          local_1c8 = local_1c8 + 1;
        } while (local_1c8 != local_80);
      }
      iVar47 = 0;
    }
  }
  piVar21 = (int *)CONCAT44(local_c8.refcount._4_4_,(int)local_c8.refcount);
  if (piVar21 != (int *)0x0) {
    LOCK();
    *piVar21 = *piVar21 + -1;
    UNLOCK();
    if (*piVar21 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_c8.data != (Allocator *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar47;
}

Assistant:

int Convolution1D_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    convolution1d_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, dilation_w, stride_w, activation_type, activation_params, opt);

    return 0;
}